

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_n<embree::sse2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,3,4>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Primitive PVar13;
  undefined4 uVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined3 uVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined8 uVar31;
  undefined1 auVar32 [16];
  undefined6 uVar33;
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [16];
  byte bVar56;
  ulong uVar57;
  ulong uVar58;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar59;
  ulong uVar60;
  int iVar61;
  RTCIntersectArguments *pRVar62;
  RTCIntersectArguments *pRVar63;
  long lVar64;
  ulong uVar65;
  undefined1 auVar66 [8];
  bool bVar67;
  uint uVar68;
  uint uVar69;
  int iVar70;
  uint uVar71;
  uint uVar72;
  short sVar73;
  float t1;
  undefined2 uVar102;
  float fVar74;
  float fVar103;
  float fVar104;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar105;
  float fVar124;
  float fVar125;
  undefined1 auVar106 [16];
  undefined1 auVar109 [16];
  undefined1 auVar112 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar126;
  float fVar143;
  float fVar145;
  vfloat4 v;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar144;
  float fVar146;
  float fVar147;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar148;
  float fVar164;
  float fVar165;
  vfloat4 v_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  float fVar166;
  float fVar169;
  float fVar170;
  vfloat4 a;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar175;
  float fVar176;
  float fVar199;
  float fVar201;
  vfloat_impl<4> p00;
  undefined1 auVar177 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  float fVar200;
  float fVar202;
  float fVar203;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar204;
  float fVar214;
  float fVar215;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar216;
  float fVar217;
  float fVar226;
  float fVar228;
  vfloat4 a_2;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  float fVar227;
  float fVar229;
  float fVar230;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar231;
  float fVar241;
  float fVar242;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar243;
  float fVar244;
  float fVar255;
  float fVar257;
  undefined1 auVar245 [16];
  undefined1 auVar248 [16];
  float fVar256;
  float fVar258;
  float fVar259;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar271;
  float fVar274;
  vfloat4 a_1;
  undefined1 auVar263 [16];
  undefined1 auVar266 [16];
  float fVar272;
  float fVar273;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar279;
  float fVar280;
  float fVar289;
  float fVar291;
  vfloat4 a_3;
  float fVar293;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar285 [16];
  float fVar290;
  float fVar292;
  float fVar294;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  float fVar295;
  float fVar304;
  float fVar305;
  float fVar306;
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float fStack_420;
  float fStack_41c;
  undefined8 local_418;
  undefined8 local_408;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_3cc;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  undefined8 uStack_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  ulong local_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  Primitive *local_2f0;
  RTCFilterFunctionNArguments local_2e8;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  uint auStack_1f8 [4];
  undefined8 local_1e8;
  float local_1e0;
  float local_1dc;
  float fStack_1d8;
  uint local_1d4;
  uint local_1d0;
  uint local_1cc;
  uint local_1c8;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  undefined8 auStack_58 [5];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 uVar101;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar162 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  
  PVar13 = prim[1];
  uVar57 = (ulong)(byte)PVar13;
  lVar20 = uVar57 * 0x25;
  pPVar4 = prim + lVar20 + 6;
  fVar145 = *(float *)(pPVar4 + 0xc);
  fVar148 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar4) * fVar145;
  fVar164 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar4 + 4)) * fVar145;
  fVar165 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar4 + 8)) * fVar145;
  fVar126 = fVar145 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar143 = fVar145 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar145 = fVar145 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar14 = *(undefined4 *)(prim + uVar57 * 4 + 6);
  uVar101 = (undefined1)((uint)uVar14 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar14 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar14));
  uVar101 = (undefined1)((uint)uVar14 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar101),uVar101);
  sVar73 = CONCAT11((char)uVar14,(char)uVar14);
  uVar58 = CONCAT62(uVar33,sVar73);
  auVar119._8_4_ = 0;
  auVar119._0_8_ = uVar58;
  auVar119._12_2_ = uVar102;
  auVar119._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar128._12_4_ = auVar119._12_4_;
  auVar128._8_2_ = 0;
  auVar128._0_8_ = uVar58;
  auVar128._10_2_ = uVar102;
  auVar75._10_6_ = auVar128._10_6_;
  auVar75._8_2_ = uVar102;
  auVar75._0_8_ = uVar58;
  uVar102 = (undefined2)uVar33;
  auVar34._4_8_ = auVar75._8_8_;
  auVar34._2_2_ = uVar102;
  auVar34._0_2_ = uVar102;
  fVar307 = (float)((int)sVar73 >> 8);
  fVar313 = (float)(auVar34._0_4_ >> 0x18);
  fVar315 = (float)(auVar75._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar57 * 5 + 6);
  uVar101 = (undefined1)((uint)uVar14 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar14 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar14));
  uVar101 = (undefined1)((uint)uVar14 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar101),uVar101);
  sVar73 = CONCAT11((char)uVar14,(char)uVar14);
  uVar58 = CONCAT62(uVar33,sVar73);
  auVar108._8_4_ = 0;
  auVar108._0_8_ = uVar58;
  auVar108._12_2_ = uVar102;
  auVar108._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar107._12_4_ = auVar108._12_4_;
  auVar107._8_2_ = 0;
  auVar107._0_8_ = uVar58;
  auVar107._10_2_ = uVar102;
  auVar106._10_6_ = auVar107._10_6_;
  auVar106._8_2_ = uVar102;
  auVar106._0_8_ = uVar58;
  uVar102 = (undefined2)uVar33;
  auVar35._4_8_ = auVar106._8_8_;
  auVar35._2_2_ = uVar102;
  auVar35._0_2_ = uVar102;
  fVar166 = (float)((int)sVar73 >> 8);
  fVar169 = (float)(auVar35._0_4_ >> 0x18);
  fVar170 = (float)(auVar106._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar57 * 6 + 6);
  uVar101 = (undefined1)((uint)uVar14 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar14 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar14));
  uVar101 = (undefined1)((uint)uVar14 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar101),uVar101);
  sVar73 = CONCAT11((char)uVar14,(char)uVar14);
  uVar58 = CONCAT62(uVar33,sVar73);
  auVar111._8_4_ = 0;
  auVar111._0_8_ = uVar58;
  auVar111._12_2_ = uVar102;
  auVar111._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar110._12_4_ = auVar111._12_4_;
  auVar110._8_2_ = 0;
  auVar110._0_8_ = uVar58;
  auVar110._10_2_ = uVar102;
  auVar109._10_6_ = auVar110._10_6_;
  auVar109._8_2_ = uVar102;
  auVar109._0_8_ = uVar58;
  uVar102 = (undefined2)uVar33;
  auVar36._4_8_ = auVar109._8_8_;
  auVar36._2_2_ = uVar102;
  auVar36._0_2_ = uVar102;
  fVar204 = (float)((int)sVar73 >> 8);
  fVar214 = (float)(auVar36._0_4_ >> 0x18);
  fVar215 = (float)(auVar109._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar57 * 0xf + 6);
  uVar101 = (undefined1)((uint)uVar14 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar14 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar14));
  uVar101 = (undefined1)((uint)uVar14 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar101),uVar101);
  sVar73 = CONCAT11((char)uVar14,(char)uVar14);
  uVar58 = CONCAT62(uVar33,sVar73);
  auVar114._8_4_ = 0;
  auVar114._0_8_ = uVar58;
  auVar114._12_2_ = uVar102;
  auVar114._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar113._12_4_ = auVar114._12_4_;
  auVar113._8_2_ = 0;
  auVar113._0_8_ = uVar58;
  auVar113._10_2_ = uVar102;
  auVar112._10_6_ = auVar113._10_6_;
  auVar112._8_2_ = uVar102;
  auVar112._0_8_ = uVar58;
  uVar102 = (undefined2)uVar33;
  auVar37._4_8_ = auVar112._8_8_;
  auVar37._2_2_ = uVar102;
  auVar37._0_2_ = uVar102;
  fVar74 = (float)((int)sVar73 >> 8);
  fVar103 = (float)(auVar37._0_4_ >> 0x18);
  fVar104 = (float)(auVar112._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  uVar101 = (undefined1)((uint)uVar14 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar14 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar14));
  uVar101 = (undefined1)((uint)uVar14 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar101),uVar101);
  sVar73 = CONCAT11((char)uVar14,(char)uVar14);
  uVar58 = CONCAT62(uVar33,sVar73);
  auVar179._8_4_ = 0;
  auVar179._0_8_ = uVar58;
  auVar179._12_2_ = uVar102;
  auVar179._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._8_2_ = 0;
  auVar178._0_8_ = uVar58;
  auVar178._10_2_ = uVar102;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = uVar102;
  auVar177._0_8_ = uVar58;
  uVar102 = (undefined2)uVar33;
  auVar38._4_8_ = auVar177._8_8_;
  auVar38._2_2_ = uVar102;
  auVar38._0_2_ = uVar102;
  fVar216 = (float)((int)sVar73 >> 8);
  fVar226 = (float)(auVar38._0_4_ >> 0x18);
  fVar228 = (float)(auVar177._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar57 + 6);
  uVar101 = (undefined1)((uint)uVar14 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar14 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar14));
  uVar101 = (undefined1)((uint)uVar14 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar101),uVar101);
  sVar73 = CONCAT11((char)uVar14,(char)uVar14);
  uVar58 = CONCAT62(uVar33,sVar73);
  auVar182._8_4_ = 0;
  auVar182._0_8_ = uVar58;
  auVar182._12_2_ = uVar102;
  auVar182._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._8_2_ = 0;
  auVar181._0_8_ = uVar58;
  auVar181._10_2_ = uVar102;
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = uVar102;
  auVar180._0_8_ = uVar58;
  uVar102 = (undefined2)uVar33;
  auVar39._4_8_ = auVar180._8_8_;
  auVar39._2_2_ = uVar102;
  auVar39._0_2_ = uVar102;
  fVar243 = (float)((int)sVar73 >> 8);
  fVar255 = (float)(auVar39._0_4_ >> 0x18);
  fVar257 = (float)(auVar180._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar57 * 0x1a + 6);
  uVar101 = (undefined1)((uint)uVar14 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar14 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar14));
  uVar101 = (undefined1)((uint)uVar14 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar101),uVar101);
  sVar73 = CONCAT11((char)uVar14,(char)uVar14);
  uVar58 = CONCAT62(uVar33,sVar73);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar58;
  auVar185._12_2_ = uVar102;
  auVar185._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar58;
  auVar184._10_2_ = uVar102;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar102;
  auVar183._0_8_ = uVar58;
  uVar102 = (undefined2)uVar33;
  auVar40._4_8_ = auVar183._8_8_;
  auVar40._2_2_ = uVar102;
  auVar40._0_2_ = uVar102;
  fVar231 = (float)((int)sVar73 >> 8);
  fVar241 = (float)(auVar40._0_4_ >> 0x18);
  fVar242 = (float)(auVar183._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar57 * 0x1b + 6);
  uVar101 = (undefined1)((uint)uVar14 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar14 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar14));
  uVar101 = (undefined1)((uint)uVar14 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar101),uVar101);
  sVar73 = CONCAT11((char)uVar14,(char)uVar14);
  uVar58 = CONCAT62(uVar33,sVar73);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar58;
  auVar188._12_2_ = uVar102;
  auVar188._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar58;
  auVar187._10_2_ = uVar102;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar102;
  auVar186._0_8_ = uVar58;
  uVar102 = (undefined2)uVar33;
  auVar41._4_8_ = auVar186._8_8_;
  auVar41._2_2_ = uVar102;
  auVar41._0_2_ = uVar102;
  fVar260 = (float)((int)sVar73 >> 8);
  fVar271 = (float)(auVar41._0_4_ >> 0x18);
  fVar274 = (float)(auVar186._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar57 * 0x1c + 6);
  uVar101 = (undefined1)((uint)uVar14 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar14 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar14));
  uVar101 = (undefined1)((uint)uVar14 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar101),uVar101);
  sVar73 = CONCAT11((char)uVar14,(char)uVar14);
  uVar58 = CONCAT62(uVar33,sVar73);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar58;
  auVar191._12_2_ = uVar102;
  auVar191._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar58;
  auVar190._10_2_ = uVar102;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar102;
  auVar189._0_8_ = uVar58;
  uVar102 = (undefined2)uVar33;
  auVar42._4_8_ = auVar189._8_8_;
  auVar42._2_2_ = uVar102;
  auVar42._0_2_ = uVar102;
  fVar105 = (float)((int)sVar73 >> 8);
  fVar124 = (float)(auVar42._0_4_ >> 0x18);
  fVar125 = (float)(auVar189._8_4_ >> 0x18);
  fVar295 = fVar126 * fVar307 + fVar143 * fVar166 + fVar145 * fVar204;
  fVar304 = fVar126 * fVar313 + fVar143 * fVar169 + fVar145 * fVar214;
  fVar305 = fVar126 * fVar315 + fVar143 * fVar170 + fVar145 * fVar215;
  fVar306 = fVar126 * (float)(auVar128._12_4_ >> 0x18) +
            fVar143 * (float)(auVar107._12_4_ >> 0x18) + fVar145 * (float)(auVar110._12_4_ >> 0x18);
  fVar279 = fVar126 * fVar74 + fVar143 * fVar216 + fVar145 * fVar243;
  fVar289 = fVar126 * fVar103 + fVar143 * fVar226 + fVar145 * fVar255;
  fVar291 = fVar126 * fVar104 + fVar143 * fVar228 + fVar145 * fVar257;
  fVar293 = fVar126 * (float)(auVar113._12_4_ >> 0x18) +
            fVar143 * (float)(auVar178._12_4_ >> 0x18) + fVar145 * (float)(auVar181._12_4_ >> 0x18);
  fVar175 = fVar126 * fVar231 + fVar143 * fVar260 + fVar145 * fVar105;
  fVar199 = fVar126 * fVar241 + fVar143 * fVar271 + fVar145 * fVar124;
  fVar201 = fVar126 * fVar242 + fVar143 * fVar274 + fVar145 * fVar125;
  fVar126 = fVar126 * (float)(auVar184._12_4_ >> 0x18) +
            fVar143 * (float)(auVar187._12_4_ >> 0x18) + fVar145 * (float)(auVar190._12_4_ >> 0x18);
  fVar308 = fVar307 * fVar148 + fVar166 * fVar164 + fVar204 * fVar165;
  fVar313 = fVar313 * fVar148 + fVar169 * fVar164 + fVar214 * fVar165;
  fVar315 = fVar315 * fVar148 + fVar170 * fVar164 + fVar215 * fVar165;
  fVar317 = (float)(auVar128._12_4_ >> 0x18) * fVar148 +
            (float)(auVar107._12_4_ >> 0x18) * fVar164 + (float)(auVar110._12_4_ >> 0x18) * fVar165;
  fVar243 = fVar74 * fVar148 + fVar216 * fVar164 + fVar243 * fVar165;
  fVar255 = fVar103 * fVar148 + fVar226 * fVar164 + fVar255 * fVar165;
  fVar257 = fVar104 * fVar148 + fVar228 * fVar164 + fVar257 * fVar165;
  fVar307 = (float)(auVar113._12_4_ >> 0x18) * fVar148 +
            (float)(auVar178._12_4_ >> 0x18) * fVar164 + (float)(auVar181._12_4_ >> 0x18) * fVar165;
  fVar231 = fVar148 * fVar231 + fVar164 * fVar260 + fVar165 * fVar105;
  fVar241 = fVar148 * fVar241 + fVar164 * fVar271 + fVar165 * fVar124;
  fVar242 = fVar148 * fVar242 + fVar164 * fVar274 + fVar165 * fVar125;
  fVar260 = fVar148 * (float)(auVar184._12_4_ >> 0x18) +
            fVar164 * (float)(auVar187._12_4_ >> 0x18) + fVar165 * (float)(auVar190._12_4_ >> 0x18);
  fVar145 = (float)DAT_01ff1d40;
  fVar74 = DAT_01ff1d40._4_4_;
  fVar103 = DAT_01ff1d40._8_4_;
  fVar104 = DAT_01ff1d40._12_4_;
  uVar68 = -(uint)(fVar145 <= ABS(fVar295));
  uVar69 = -(uint)(fVar74 <= ABS(fVar304));
  uVar71 = -(uint)(fVar103 <= ABS(fVar305));
  uVar72 = -(uint)(fVar104 <= ABS(fVar306));
  auVar296._0_4_ = (uint)fVar295 & uVar68;
  auVar296._4_4_ = (uint)fVar304 & uVar69;
  auVar296._8_4_ = (uint)fVar305 & uVar71;
  auVar296._12_4_ = (uint)fVar306 & uVar72;
  auVar149._0_4_ = ~uVar68 & (uint)fVar145;
  auVar149._4_4_ = ~uVar69 & (uint)fVar74;
  auVar149._8_4_ = ~uVar71 & (uint)fVar103;
  auVar149._12_4_ = ~uVar72 & (uint)fVar104;
  auVar149 = auVar149 | auVar296;
  uVar68 = -(uint)(fVar145 <= ABS(fVar279));
  uVar69 = -(uint)(fVar74 <= ABS(fVar289));
  uVar71 = -(uint)(fVar103 <= ABS(fVar291));
  uVar72 = -(uint)(fVar104 <= ABS(fVar293));
  auVar281._0_4_ = (uint)fVar279 & uVar68;
  auVar281._4_4_ = (uint)fVar289 & uVar69;
  auVar281._8_4_ = (uint)fVar291 & uVar71;
  auVar281._12_4_ = (uint)fVar293 & uVar72;
  auVar205._0_4_ = ~uVar68 & (uint)fVar145;
  auVar205._4_4_ = ~uVar69 & (uint)fVar74;
  auVar205._8_4_ = ~uVar71 & (uint)fVar103;
  auVar205._12_4_ = ~uVar72 & (uint)fVar104;
  auVar205 = auVar205 | auVar281;
  uVar68 = -(uint)(fVar145 <= ABS(fVar175));
  uVar69 = -(uint)(fVar74 <= ABS(fVar199));
  uVar71 = -(uint)(fVar103 <= ABS(fVar201));
  uVar72 = -(uint)(fVar104 <= ABS(fVar126));
  auVar192._0_4_ = (uint)fVar175 & uVar68;
  auVar192._4_4_ = (uint)fVar199 & uVar69;
  auVar192._8_4_ = (uint)fVar201 & uVar71;
  auVar192._12_4_ = (uint)fVar126 & uVar72;
  auVar218._0_4_ = ~uVar68 & (uint)fVar145;
  auVar218._4_4_ = ~uVar69 & (uint)fVar74;
  auVar218._8_4_ = ~uVar71 & (uint)fVar103;
  auVar218._12_4_ = ~uVar72 & (uint)fVar104;
  auVar218 = auVar218 | auVar192;
  auVar75 = rcpps(_DAT_01ff1d40,auVar149);
  fVar145 = auVar75._0_4_;
  fVar104 = auVar75._4_4_;
  fVar166 = auVar75._8_4_;
  fVar216 = auVar75._12_4_;
  fVar145 = (1.0 - auVar149._0_4_ * fVar145) * fVar145 + fVar145;
  fVar104 = (1.0 - auVar149._4_4_ * fVar104) * fVar104 + fVar104;
  fVar166 = (1.0 - auVar149._8_4_ * fVar166) * fVar166 + fVar166;
  fVar216 = (1.0 - auVar149._12_4_ * fVar216) * fVar216 + fVar216;
  auVar75 = rcpps(auVar75,auVar205);
  fVar74 = auVar75._0_4_;
  fVar105 = auVar75._4_4_;
  fVar169 = auVar75._8_4_;
  fVar226 = auVar75._12_4_;
  fVar74 = (1.0 - auVar205._0_4_ * fVar74) * fVar74 + fVar74;
  fVar105 = (1.0 - auVar205._4_4_ * fVar105) * fVar105 + fVar105;
  fVar169 = (1.0 - auVar205._8_4_ * fVar169) * fVar169 + fVar169;
  fVar226 = (1.0 - auVar205._12_4_ * fVar226) * fVar226 + fVar226;
  auVar75 = rcpps(auVar75,auVar218);
  fVar103 = auVar75._0_4_;
  fVar124 = auVar75._4_4_;
  fVar170 = auVar75._8_4_;
  fVar228 = auVar75._12_4_;
  fVar103 = (1.0 - auVar218._0_4_ * fVar103) * fVar103 + fVar103;
  fVar124 = (1.0 - auVar218._4_4_ * fVar124) * fVar124 + fVar124;
  fVar170 = (1.0 - auVar218._8_4_ * fVar170) * fVar170 + fVar170;
  fVar228 = (1.0 - auVar218._12_4_ * fVar228) * fVar228 + fVar228;
  fVar271 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar20 + 0x16)) *
            *(float *)(prim + lVar20 + 0x1a);
  uVar58 = *(ulong *)(prim + uVar57 * 7 + 6);
  uVar102 = (undefined2)(uVar58 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar58;
  auVar76._12_2_ = uVar102;
  auVar76._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar58 >> 0x20);
  auVar320._12_4_ = auVar76._12_4_;
  auVar320._8_2_ = 0;
  auVar320._0_8_ = uVar58;
  auVar320._10_2_ = uVar102;
  auVar130._10_6_ = auVar320._10_6_;
  auVar130._8_2_ = uVar102;
  auVar130._0_8_ = uVar58;
  uVar102 = (undefined2)(uVar58 >> 0x10);
  auVar43._4_8_ = auVar130._8_8_;
  auVar43._2_2_ = uVar102;
  auVar43._0_2_ = uVar102;
  fVar125 = (float)(auVar43._0_4_ >> 0x10);
  fVar175 = (float)(auVar130._8_4_ >> 0x10);
  uVar5 = *(ulong *)(prim + uVar57 * 0xb + 6);
  uVar102 = (undefined2)(uVar5 >> 0x30);
  auVar152._8_4_ = 0;
  auVar152._0_8_ = uVar5;
  auVar152._12_2_ = uVar102;
  auVar152._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar5 >> 0x20);
  auVar151._12_4_ = auVar152._12_4_;
  auVar151._8_2_ = 0;
  auVar151._0_8_ = uVar5;
  auVar151._10_2_ = uVar102;
  auVar150._10_6_ = auVar151._10_6_;
  auVar150._8_2_ = uVar102;
  auVar150._0_8_ = uVar5;
  uVar102 = (undefined2)(uVar5 >> 0x10);
  auVar44._4_8_ = auVar150._8_8_;
  auVar44._2_2_ = uVar102;
  auVar44._0_2_ = uVar102;
  uVar60 = *(ulong *)(prim + uVar57 * 9 + 6);
  uVar102 = (undefined2)(uVar60 >> 0x30);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar60;
  auVar79._12_2_ = uVar102;
  auVar79._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar60 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar60;
  auVar78._10_2_ = uVar102;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar102;
  auVar77._0_8_ = uVar60;
  uVar102 = (undefined2)(uVar60 >> 0x10);
  auVar45._4_8_ = auVar77._8_8_;
  auVar45._2_2_ = uVar102;
  auVar45._0_2_ = uVar102;
  fVar126 = (float)(auVar45._0_4_ >> 0x10);
  fVar199 = (float)(auVar77._8_4_ >> 0x10);
  uVar6 = *(ulong *)(prim + uVar57 * 0xd + 6);
  uVar102 = (undefined2)(uVar6 >> 0x30);
  auVar221._8_4_ = 0;
  auVar221._0_8_ = uVar6;
  auVar221._12_2_ = uVar102;
  auVar221._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar6 >> 0x20);
  auVar220._12_4_ = auVar221._12_4_;
  auVar220._8_2_ = 0;
  auVar220._0_8_ = uVar6;
  auVar220._10_2_ = uVar102;
  auVar219._10_6_ = auVar220._10_6_;
  auVar219._8_2_ = uVar102;
  auVar219._0_8_ = uVar6;
  uVar102 = (undefined2)(uVar6 >> 0x10);
  auVar46._4_8_ = auVar219._8_8_;
  auVar46._2_2_ = uVar102;
  auVar46._0_2_ = uVar102;
  uVar7 = *(ulong *)(prim + uVar57 * 0x12 + 6);
  uVar102 = (undefined2)(uVar7 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar7;
  auVar82._12_2_ = uVar102;
  auVar82._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar7 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar7;
  auVar81._10_2_ = uVar102;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar102;
  auVar80._0_8_ = uVar7;
  uVar102 = (undefined2)(uVar7 >> 0x10);
  auVar47._4_8_ = auVar80._8_8_;
  auVar47._2_2_ = uVar102;
  auVar47._0_2_ = uVar102;
  fVar143 = (float)(auVar47._0_4_ >> 0x10);
  fVar201 = (float)(auVar80._8_4_ >> 0x10);
  uVar65 = (ulong)(uint)((int)(uVar57 * 5) << 2);
  uVar8 = *(ulong *)(prim + uVar57 * 2 + uVar65 + 6);
  uVar102 = (undefined2)(uVar8 >> 0x30);
  auVar247._8_4_ = 0;
  auVar247._0_8_ = uVar8;
  auVar247._12_2_ = uVar102;
  auVar247._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar8 >> 0x20);
  auVar246._12_4_ = auVar247._12_4_;
  auVar246._8_2_ = 0;
  auVar246._0_8_ = uVar8;
  auVar246._10_2_ = uVar102;
  auVar245._10_6_ = auVar246._10_6_;
  auVar245._8_2_ = uVar102;
  auVar245._0_8_ = uVar8;
  uVar102 = (undefined2)(uVar8 >> 0x10);
  auVar48._4_8_ = auVar245._8_8_;
  auVar48._2_2_ = uVar102;
  auVar48._0_2_ = uVar102;
  uVar65 = *(ulong *)(prim + uVar65 + 6);
  uVar102 = (undefined2)(uVar65 >> 0x30);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar65;
  auVar85._12_2_ = uVar102;
  auVar85._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar65 >> 0x20);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar65;
  auVar84._10_2_ = uVar102;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar102;
  auVar83._0_8_ = uVar65;
  uVar102 = (undefined2)(uVar65 >> 0x10);
  auVar49._4_8_ = auVar83._8_8_;
  auVar49._2_2_ = uVar102;
  auVar49._0_2_ = uVar102;
  fVar148 = (float)(auVar49._0_4_ >> 0x10);
  fVar204 = (float)(auVar83._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar57 * 0x18 + 6);
  uVar102 = (undefined2)(uVar9 >> 0x30);
  auVar265._8_4_ = 0;
  auVar265._0_8_ = uVar9;
  auVar265._12_2_ = uVar102;
  auVar265._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar9 >> 0x20);
  auVar264._12_4_ = auVar265._12_4_;
  auVar264._8_2_ = 0;
  auVar264._0_8_ = uVar9;
  auVar264._10_2_ = uVar102;
  auVar263._10_6_ = auVar264._10_6_;
  auVar263._8_2_ = uVar102;
  auVar263._0_8_ = uVar9;
  uVar102 = (undefined2)(uVar9 >> 0x10);
  auVar50._4_8_ = auVar263._8_8_;
  auVar50._2_2_ = uVar102;
  auVar50._0_2_ = uVar102;
  uVar10 = *(ulong *)(prim + uVar57 * 0x1d + 6);
  uVar102 = (undefined2)(uVar10 >> 0x30);
  auVar88._8_4_ = 0;
  auVar88._0_8_ = uVar10;
  auVar88._12_2_ = uVar102;
  auVar88._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar10 >> 0x20);
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar10;
  auVar87._10_2_ = uVar102;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._8_2_ = uVar102;
  auVar86._0_8_ = uVar10;
  uVar102 = (undefined2)(uVar10 >> 0x10);
  auVar51._4_8_ = auVar86._8_8_;
  auVar51._2_2_ = uVar102;
  auVar51._0_2_ = uVar102;
  fVar164 = (float)(auVar51._0_4_ >> 0x10);
  fVar214 = (float)(auVar86._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar57 + (ulong)(byte)PVar13 * 0x20 + 6);
  uVar102 = (undefined2)(uVar11 >> 0x30);
  auVar284._8_4_ = 0;
  auVar284._0_8_ = uVar11;
  auVar284._12_2_ = uVar102;
  auVar284._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar11 >> 0x20);
  auVar283._12_4_ = auVar284._12_4_;
  auVar283._8_2_ = 0;
  auVar283._0_8_ = uVar11;
  auVar283._10_2_ = uVar102;
  auVar282._10_6_ = auVar283._10_6_;
  auVar282._8_2_ = uVar102;
  auVar282._0_8_ = uVar11;
  uVar102 = (undefined2)(uVar11 >> 0x10);
  auVar52._4_8_ = auVar282._8_8_;
  auVar52._2_2_ = uVar102;
  auVar52._0_2_ = uVar102;
  uVar12 = *(ulong *)(prim + ((ulong)(byte)PVar13 * 0x20 - uVar57) + 6);
  uVar102 = (undefined2)(uVar12 >> 0x30);
  auVar91._8_4_ = 0;
  auVar91._0_8_ = uVar12;
  auVar91._12_2_ = uVar102;
  auVar91._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar12 >> 0x20);
  auVar90._12_4_ = auVar91._12_4_;
  auVar90._8_2_ = 0;
  auVar90._0_8_ = uVar12;
  auVar90._10_2_ = uVar102;
  auVar89._10_6_ = auVar90._10_6_;
  auVar89._8_2_ = uVar102;
  auVar89._0_8_ = uVar12;
  uVar102 = (undefined2)(uVar12 >> 0x10);
  auVar53._4_8_ = auVar89._8_8_;
  auVar53._2_2_ = uVar102;
  auVar53._0_2_ = uVar102;
  fVar165 = (float)(auVar53._0_4_ >> 0x10);
  fVar215 = (float)(auVar89._8_4_ >> 0x10);
  uVar57 = *(ulong *)(prim + uVar57 * 0x23 + 6);
  uVar102 = (undefined2)(uVar57 >> 0x30);
  auVar299._8_4_ = 0;
  auVar299._0_8_ = uVar57;
  auVar299._12_2_ = uVar102;
  auVar299._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar57 >> 0x20);
  auVar298._12_4_ = auVar299._12_4_;
  auVar298._8_2_ = 0;
  auVar298._0_8_ = uVar57;
  auVar298._10_2_ = uVar102;
  auVar297._10_6_ = auVar298._10_6_;
  auVar297._8_2_ = uVar102;
  auVar297._0_8_ = uVar57;
  uVar102 = (undefined2)(uVar57 >> 0x10);
  auVar54._4_8_ = auVar297._8_8_;
  auVar54._2_2_ = uVar102;
  auVar54._0_2_ = uVar102;
  auVar153._0_8_ =
       CONCAT44(((((float)(auVar44._0_4_ >> 0x10) - fVar125) * fVar271 + fVar125) - fVar313) *
                fVar104,((((float)(int)(short)uVar5 - (float)(int)(short)uVar58) * fVar271 +
                         (float)(int)(short)uVar58) - fVar308) * fVar145);
  auVar153._8_4_ =
       ((((float)(auVar150._8_4_ >> 0x10) - fVar175) * fVar271 + fVar175) - fVar315) * fVar166;
  auVar153._12_4_ =
       ((((float)(auVar151._12_4_ >> 0x10) - (float)(auVar320._12_4_ >> 0x10)) * fVar271 +
        (float)(auVar320._12_4_ >> 0x10)) - fVar317) * fVar216;
  auVar222._0_4_ =
       ((((float)(int)(short)uVar6 - (float)(int)(short)uVar60) * fVar271 +
        (float)(int)(short)uVar60) - fVar308) * fVar145;
  auVar222._4_4_ =
       ((((float)(auVar46._0_4_ >> 0x10) - fVar126) * fVar271 + fVar126) - fVar313) * fVar104;
  auVar222._8_4_ =
       ((((float)(auVar219._8_4_ >> 0x10) - fVar199) * fVar271 + fVar199) - fVar315) * fVar166;
  auVar222._12_4_ =
       ((((float)(auVar220._12_4_ >> 0x10) - (float)(auVar78._12_4_ >> 0x10)) * fVar271 +
        (float)(auVar78._12_4_ >> 0x10)) - fVar317) * fVar216;
  auVar248._0_8_ =
       CONCAT44(((((float)(auVar48._0_4_ >> 0x10) - fVar143) * fVar271 + fVar143) - fVar255) *
                fVar105,((((float)(int)(short)uVar8 - (float)(int)(short)uVar7) * fVar271 +
                         (float)(int)(short)uVar7) - fVar243) * fVar74);
  auVar248._8_4_ =
       ((((float)(auVar245._8_4_ >> 0x10) - fVar201) * fVar271 + fVar201) - fVar257) * fVar169;
  auVar248._12_4_ =
       ((((float)(auVar246._12_4_ >> 0x10) - (float)(auVar81._12_4_ >> 0x10)) * fVar271 +
        (float)(auVar81._12_4_ >> 0x10)) - fVar307) * fVar226;
  auVar266._0_4_ =
       ((((float)(int)(short)uVar9 - (float)(int)(short)uVar65) * fVar271 +
        (float)(int)(short)uVar65) - fVar243) * fVar74;
  auVar266._4_4_ =
       ((((float)(auVar50._0_4_ >> 0x10) - fVar148) * fVar271 + fVar148) - fVar255) * fVar105;
  auVar266._8_4_ =
       ((((float)(auVar263._8_4_ >> 0x10) - fVar204) * fVar271 + fVar204) - fVar257) * fVar169;
  auVar266._12_4_ =
       ((((float)(auVar264._12_4_ >> 0x10) - (float)(auVar84._12_4_ >> 0x10)) * fVar271 +
        (float)(auVar84._12_4_ >> 0x10)) - fVar307) * fVar226;
  auVar285._0_8_ =
       CONCAT44(((((float)(auVar52._0_4_ >> 0x10) - fVar164) * fVar271 + fVar164) - fVar241) *
                fVar124,((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar271 +
                         (float)(int)(short)uVar10) - fVar231) * fVar103);
  auVar285._8_4_ =
       ((((float)(auVar282._8_4_ >> 0x10) - fVar214) * fVar271 + fVar214) - fVar242) * fVar170;
  auVar285._12_4_ =
       ((((float)(auVar283._12_4_ >> 0x10) - (float)(auVar87._12_4_ >> 0x10)) * fVar271 +
        (float)(auVar87._12_4_ >> 0x10)) - fVar260) * fVar228;
  auVar300._0_4_ =
       ((((float)(int)(short)uVar57 - (float)(int)(short)uVar12) * fVar271 +
        (float)(int)(short)uVar12) - fVar231) * fVar103;
  auVar300._4_4_ =
       ((((float)(auVar54._0_4_ >> 0x10) - fVar165) * fVar271 + fVar165) - fVar241) * fVar124;
  auVar300._8_4_ =
       ((((float)(auVar297._8_4_ >> 0x10) - fVar215) * fVar271 + fVar215) - fVar242) * fVar170;
  auVar300._12_4_ =
       ((((float)(auVar298._12_4_ >> 0x10) - (float)(auVar90._12_4_ >> 0x10)) * fVar271 +
        (float)(auVar90._12_4_ >> 0x10)) - fVar260) * fVar228;
  auVar127._8_4_ = auVar153._8_4_;
  auVar127._0_8_ = auVar153._0_8_;
  auVar127._12_4_ = auVar153._12_4_;
  auVar128 = minps(auVar127,auVar222);
  auVar92._8_4_ = auVar248._8_4_;
  auVar92._0_8_ = auVar248._0_8_;
  auVar92._12_4_ = auVar248._12_4_;
  auVar75 = minps(auVar92,auVar266);
  auVar128 = maxps(auVar128,auVar75);
  auVar93._8_4_ = auVar285._8_4_;
  auVar93._0_8_ = auVar285._0_8_;
  auVar93._12_4_ = auVar285._12_4_;
  auVar75 = minps(auVar93,auVar300);
  uVar14 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar115._4_4_ = uVar14;
  auVar115._0_4_ = uVar14;
  auVar115._8_4_ = uVar14;
  auVar115._12_4_ = uVar14;
  auVar75 = maxps(auVar75,auVar115);
  auVar75 = maxps(auVar128,auVar75);
  local_1b8 = auVar75._0_4_ * 0.99999964;
  fStack_1b4 = auVar75._4_4_ * 0.99999964;
  fStack_1b0 = auVar75._8_4_ * 0.99999964;
  fStack_1ac = auVar75._12_4_ * 0.99999964;
  auVar75 = maxps(auVar153,auVar222);
  auVar128 = maxps(auVar248,auVar266);
  auVar75 = minps(auVar75,auVar128);
  auVar128 = maxps(auVar285,auVar300);
  fVar145 = (ray->super_RayK<1>).tfar;
  auVar94._4_4_ = fVar145;
  auVar94._0_4_ = fVar145;
  auVar94._8_4_ = fVar145;
  auVar94._12_4_ = fVar145;
  auVar128 = minps(auVar128,auVar94);
  auVar75 = minps(auVar75,auVar128);
  uVar68 = (uint)(byte)PVar13;
  auVar116._0_4_ = -(uint)(uVar68 != 0 && local_1b8 <= auVar75._0_4_ * 1.0000004);
  auVar116._4_4_ = -(uint)(1 < uVar68 && fStack_1b4 <= auVar75._4_4_ * 1.0000004);
  auVar116._8_4_ = -(uint)(2 < uVar68 && fStack_1b0 <= auVar75._8_4_ * 1.0000004);
  auVar116._12_4_ = -(uint)(3 < uVar68 && fStack_1ac <= auVar75._12_4_ * 1.0000004);
  uVar68 = movmskps(uVar68,auVar116);
  if (uVar68 == 0) {
    return;
  }
  uVar68 = uVar68 & 0xff;
  local_168._0_12_ = mm_lookupmask_ps._240_12_;
  local_168._12_4_ = 0;
  local_2f0 = prim;
LAB_00c31d4c:
  lVar20 = 0;
  if ((ulong)uVar68 != 0) {
    for (; (uVar68 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
    }
  }
  uVar69 = *(uint *)(local_2f0 + 2);
  uVar71 = *(uint *)(local_2f0 + lVar20 * 4 + 6);
  pGVar15 = (context->scene->geometries).items[uVar69].ptr;
  fVar145 = pGVar15->fnumTimeSegments;
  fVar74 = (pGVar15->time_range).lower;
  fVar103 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar74) /
            ((pGVar15->time_range).upper - fVar74)) * fVar145;
  fVar74 = floorf(fVar103);
  fVar145 = fVar145 + -1.0;
  if (fVar145 <= fVar74) {
    fVar74 = fVar145;
  }
  fVar145 = 0.0;
  if (0.0 <= fVar74) {
    fVar145 = fVar74;
  }
  fVar103 = fVar103 - fVar145;
  local_340 = (ulong)uVar71;
  uVar58 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                           (ulong)uVar71 *
                           pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var16 = pGVar15[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar64 = (long)(int)fVar145 * 0x38;
  lVar17 = *(long *)(_Var16 + lVar64);
  lVar18 = *(long *)(_Var16 + 0x10 + lVar64);
  pfVar3 = (float *)(lVar17 + lVar18 * uVar58);
  fVar145 = *pfVar3;
  fVar74 = pfVar3[1];
  fVar104 = pfVar3[2];
  fVar105 = pfVar3[3];
  lVar20 = uVar58 + 1;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar20);
  fVar124 = *pfVar3;
  fVar125 = pfVar3[1];
  fVar126 = pfVar3[2];
  fVar143 = pfVar3[3];
  lVar1 = uVar58 + 2;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar1);
  fVar148 = *pfVar3;
  fVar164 = pfVar3[1];
  fVar165 = pfVar3[2];
  fVar166 = pfVar3[3];
  lVar2 = uVar58 + 3;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar2);
  fVar169 = *pfVar3;
  fVar170 = pfVar3[1];
  fVar175 = pfVar3[2];
  fVar199 = pfVar3[3];
  lVar17 = *(long *)&pGVar15[4].fnumTimeSegments;
  lVar18 = *(long *)(lVar17 + lVar64);
  lVar19 = *(long *)(lVar17 + 0x10 + lVar64);
  pfVar3 = (float *)(lVar18 + lVar19 * uVar58);
  fVar201 = *pfVar3;
  fVar204 = pfVar3[1];
  fVar214 = pfVar3[2];
  fVar215 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar20);
  fVar216 = *pfVar3;
  fVar226 = pfVar3[1];
  fVar228 = pfVar3[2];
  fVar243 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar1);
  fVar255 = *pfVar3;
  fVar257 = pfVar3[1];
  fVar307 = pfVar3[2];
  fVar231 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar2);
  fVar241 = *pfVar3;
  fVar242 = pfVar3[1];
  fVar260 = pfVar3[2];
  fVar271 = pfVar3[3];
  fVar317 = (fVar148 * 0.5 + fVar169 * 0.0 + fVar124 * 0.0) - fVar145 * 0.5;
  fVar144 = (fVar164 * 0.5 + fVar170 * 0.0 + fVar125 * 0.0) - fVar74 * 0.5;
  fVar146 = (fVar165 * 0.5 + fVar175 * 0.0 + fVar126 * 0.0) - fVar104 * 0.5;
  fVar147 = (fVar166 * 0.5 + fVar199 * 0.0 + fVar143 * 0.0) - fVar105 * 0.5;
  fVar280 = (fVar255 * 0.5 + fVar241 * 0.0 + fVar216 * 0.0) - fVar201 * 0.5;
  fVar290 = (fVar257 * 0.5 + fVar242 * 0.0 + fVar226 * 0.0) - fVar204 * 0.5;
  fVar292 = (fVar307 * 0.5 + fVar260 * 0.0 + fVar228 * 0.0) - fVar214 * 0.5;
  fVar294 = (fVar231 * 0.5 + fVar271 * 0.0 + fVar243 * 0.0) - fVar215 * 0.5;
  fVar279 = fVar148 * 0.0 + fVar169 * -0.0 + fVar124 + fVar145 * -0.0;
  fVar291 = fVar164 * 0.0 + fVar170 * -0.0 + fVar125 + fVar74 * -0.0;
  fVar295 = fVar165 * 0.0 + fVar175 * -0.0 + fVar126 + fVar104 * -0.0;
  fVar305 = fVar166 * 0.0 + fVar199 * -0.0 + fVar143 + fVar105 * -0.0;
  fVar309 = fVar255 * 0.0 + fVar241 * -0.0 + fVar216 + fVar201 * -0.0;
  fVar314 = fVar257 * 0.0 + fVar242 * -0.0 + fVar226 + fVar204 * -0.0;
  fVar316 = fVar307 * 0.0 + fVar260 * -0.0 + fVar228 + fVar214 * -0.0;
  fVar318 = fVar231 * 0.0 + fVar271 * -0.0 + fVar243 + fVar215 * -0.0;
  fVar274 = fVar169 * -0.0 + fVar148 + fVar124 * 0.0 + fVar145 * -0.0;
  fVar289 = fVar170 * -0.0 + fVar164 + fVar125 * 0.0 + fVar74 * -0.0;
  fVar293 = fVar175 * -0.0 + fVar165 + fVar126 * 0.0 + fVar104 * -0.0;
  fVar304 = fVar199 * -0.0 + fVar166 + fVar143 * 0.0 + fVar105 * -0.0;
  fVar306 = fVar145 * 0.0 + ((fVar169 * 0.5 + fVar148 * 0.0) - fVar124 * 0.5);
  fVar308 = fVar74 * 0.0 + ((fVar170 * 0.5 + fVar164 * 0.0) - fVar125 * 0.5);
  fVar313 = fVar104 * 0.0 + ((fVar175 * 0.5 + fVar165 * 0.0) - fVar126 * 0.5);
  fVar315 = fVar105 * 0.0 + ((fVar199 * 0.5 + fVar166 * 0.0) - fVar143 * 0.5);
  fVar124 = fVar241 * -0.0 + fVar255 + fVar216 * 0.0 + fVar201 * -0.0;
  fVar125 = fVar242 * -0.0 + fVar257 + fVar226 * 0.0 + fVar204 * -0.0;
  fVar126 = fVar260 * -0.0 + fVar307 + fVar228 * 0.0 + fVar214 * -0.0;
  fVar148 = fVar271 * -0.0 + fVar231 + fVar243 * 0.0 + fVar215 * -0.0;
  fVar145 = fVar201 * 0.0 + ((fVar241 * 0.5 + fVar255 * 0.0) - fVar216 * 0.5);
  fVar74 = fVar204 * 0.0 + ((fVar242 * 0.5 + fVar257 * 0.0) - fVar226 * 0.5);
  fVar104 = fVar214 * 0.0 + ((fVar260 * 0.5 + fVar307 * 0.0) - fVar228 * 0.5);
  fVar105 = fVar215 * 0.0 + ((fVar271 * 0.5 + fVar231 * 0.0) - fVar243 * 0.5);
  fVar216 = fVar144 * fVar309 - fVar314 * fVar317;
  fVar226 = fVar146 * fVar314 - fVar316 * fVar144;
  fVar228 = fVar317 * fVar316 - fVar309 * fVar146;
  fVar243 = fVar147 * fVar318 - fVar318 * fVar147;
  fVar169 = fVar144 * fVar280 - fVar290 * fVar317;
  fVar175 = fVar146 * fVar290 - fVar292 * fVar144;
  fVar199 = fVar317 * fVar292 - fVar280 * fVar146;
  fVar143 = fVar308 * fVar124 - fVar125 * fVar306;
  fVar164 = fVar313 * fVar125 - fVar126 * fVar308;
  fVar165 = fVar306 * fVar126 - fVar124 * fVar313;
  fVar166 = fVar315 * fVar148 - fVar148 * fVar315;
  fVar124 = fVar308 * fVar145 - fVar74 * fVar306;
  fVar125 = fVar313 * fVar74 - fVar104 * fVar308;
  fVar104 = fVar306 * fVar104 - fVar145 * fVar313;
  fVar204 = fVar228 * fVar228 + fVar226 * fVar226 + fVar216 * fVar216;
  auVar128 = ZEXT416((uint)fVar204);
  auVar75 = rsqrtss(ZEXT416((uint)fVar204),auVar128);
  fVar145 = auVar75._0_4_;
  fVar214 = fVar145 * 1.5 - fVar145 * fVar145 * fVar204 * 0.5 * fVar145;
  fVar255 = fVar216 * fVar169 + fVar228 * fVar199 + fVar226 * fVar175;
  fVar145 = fVar243 * fVar214;
  auVar75 = rcpss(auVar128,auVar128);
  fVar170 = (2.0 - fVar204 * auVar75._0_4_) * auVar75._0_4_;
  fVar201 = fVar165 * fVar165 + fVar164 * fVar164 + fVar143 * fVar143;
  auVar75 = ZEXT416((uint)fVar201);
  auVar128 = rsqrtss(ZEXT416((uint)fVar201),auVar75);
  fVar74 = auVar128._0_4_;
  fVar148 = fVar74 * 1.5 - fVar74 * fVar74 * fVar201 * 0.5 * fVar74;
  fVar215 = fVar143 * fVar124 + fVar165 * fVar104 + fVar164 * fVar125;
  fVar126 = fVar166 * fVar148;
  auVar75 = rcpss(auVar75,auVar75);
  fVar74 = (2.0 - fVar201 * auVar75._0_4_) * auVar75._0_4_;
  fVar217 = fVar305 * fVar226 * fVar214;
  fVar227 = fVar305 * fVar228 * fVar214;
  fVar229 = fVar305 * fVar216 * fVar214;
  fVar230 = fVar305 * fVar145;
  fVar261 = fVar279 - fVar217;
  fVar272 = fVar291 - fVar227;
  fVar275 = fVar295 - fVar229;
  fVar277 = fVar305 - fVar230;
  fVar244 = fVar305 * fVar170 * (fVar204 * fVar175 - fVar255 * fVar226) * fVar214 +
            fVar147 * fVar226 * fVar214;
  fVar256 = fVar305 * fVar170 * (fVar204 * fVar199 - fVar255 * fVar228) * fVar214 +
            fVar147 * fVar228 * fVar214;
  fVar258 = fVar305 * fVar170 * (fVar204 * fVar169 - fVar255 * fVar216) * fVar214 +
            fVar147 * fVar216 * fVar214;
  fVar259 = fVar305 * fVar170 * (fVar204 * (fVar147 * fVar294 - fVar294 * fVar147) -
                                fVar255 * fVar243) * fVar214 + fVar147 * fVar145;
  fVar217 = fVar217 + fVar279;
  fVar227 = fVar227 + fVar291;
  fVar229 = fVar229 + fVar295;
  fVar230 = fVar230 + fVar305;
  fVar279 = fVar304 * fVar164 * fVar148;
  fVar291 = fVar304 * fVar165 * fVar148;
  fVar295 = fVar304 * fVar143 * fVar148;
  fVar305 = fVar304 * fVar126;
  fVar309 = fVar274 - fVar279;
  fVar316 = fVar289 - fVar291;
  fVar171 = fVar293 - fVar295;
  fVar173 = fVar304 - fVar305;
  fVar280 = fVar304 * fVar74 * (fVar201 * fVar125 - fVar215 * fVar164) * fVar148 +
            fVar315 * fVar164 * fVar148;
  fVar290 = fVar304 * fVar74 * (fVar201 * fVar104 - fVar215 * fVar165) * fVar148 +
            fVar315 * fVar165 * fVar148;
  fVar292 = fVar304 * fVar74 * (fVar201 * fVar124 - fVar215 * fVar143) * fVar148 +
            fVar315 * fVar143 * fVar148;
  fVar294 = fVar304 * fVar74 * (fVar201 * (fVar315 * fVar105 - fVar105 * fVar315) -
                               fVar215 * fVar166) * fVar148 + fVar315 * fVar126;
  fVar279 = fVar279 + fVar274;
  fVar291 = fVar291 + fVar289;
  fVar295 = fVar295 + fVar293;
  fVar305 = fVar305 + fVar304;
  lVar18 = *(long *)(_Var16 + 0x38 + lVar64);
  lVar19 = *(long *)(_Var16 + 0x48 + lVar64);
  pfVar3 = (float *)(lVar18 + lVar19 * uVar58);
  fVar145 = *pfVar3;
  fVar74 = pfVar3[1];
  fVar104 = pfVar3[2];
  fVar105 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar20);
  fVar124 = *pfVar3;
  fVar125 = pfVar3[1];
  fVar126 = pfVar3[2];
  fVar143 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar1);
  fVar148 = *pfVar3;
  fVar164 = pfVar3[1];
  fVar165 = pfVar3[2];
  fVar166 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar2);
  fVar169 = *pfVar3;
  fVar170 = pfVar3[1];
  fVar175 = pfVar3[2];
  fVar199 = pfVar3[3];
  fVar314 = (fVar148 * 0.5 + fVar169 * 0.0 + fVar124 * 0.0) - fVar145 * 0.5;
  fVar318 = (fVar164 * 0.5 + fVar170 * 0.0 + fVar125 * 0.0) - fVar74 * 0.5;
  fVar172 = (fVar165 * 0.5 + fVar175 * 0.0 + fVar126 * 0.0) - fVar104 * 0.5;
  fVar174 = (fVar166 * 0.5 + fVar199 * 0.0 + fVar143 * 0.0) - fVar105 * 0.5;
  lVar18 = *(long *)(lVar17 + 0x38 + lVar64);
  lVar17 = *(long *)(lVar17 + 0x48 + lVar64);
  pRVar62 = (RTCIntersectArguments *)(lVar20 * lVar17);
  pfVar3 = (float *)(lVar18 + lVar17 * lVar2);
  fVar201 = *pfVar3;
  fVar204 = pfVar3[1];
  fVar214 = pfVar3[2];
  fVar215 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar1 * lVar17);
  fVar216 = *pfVar3;
  fVar226 = pfVar3[1];
  fVar228 = pfVar3[2];
  fVar243 = pfVar3[3];
  pfVar3 = (float *)((long)&pRVar62->flags + lVar18);
  fVar255 = *pfVar3;
  fVar257 = pfVar3[1];
  fVar307 = pfVar3[2];
  fVar231 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + uVar58 * lVar17);
  fVar241 = *pfVar3;
  fVar242 = pfVar3[1];
  fVar260 = pfVar3[2];
  fVar271 = pfVar3[3];
  fVar262 = (fVar216 * 0.5 + fVar201 * 0.0 + fVar255 * 0.0) - fVar241 * 0.5;
  fVar273 = (fVar226 * 0.5 + fVar204 * 0.0 + fVar257 * 0.0) - fVar242 * 0.5;
  fVar276 = (fVar228 * 0.5 + fVar214 * 0.0 + fVar307 * 0.0) - fVar260 * 0.5;
  fVar278 = (fVar243 * 0.5 + fVar215 * 0.0 + fVar231 * 0.0) - fVar271 * 0.5;
  fVar274 = fVar148 * 0.0 + fVar169 * -0.0 + fVar124 + fVar145 * -0.0;
  fVar289 = fVar164 * 0.0 + fVar170 * -0.0 + fVar125 + fVar74 * -0.0;
  fVar293 = fVar165 * 0.0 + fVar175 * -0.0 + fVar126 + fVar104 * -0.0;
  fVar304 = fVar166 * 0.0 + fVar199 * -0.0 + fVar143 + fVar105 * -0.0;
  fVar176 = fVar169 * -0.0 + fVar148 + fVar124 * 0.0 + fVar145 * -0.0;
  fVar200 = fVar170 * -0.0 + fVar164 + fVar125 * 0.0 + fVar74 * -0.0;
  fVar202 = fVar175 * -0.0 + fVar165 + fVar126 * 0.0 + fVar104 * -0.0;
  fVar203 = fVar199 * -0.0 + fVar166 + fVar143 * 0.0 + fVar105 * -0.0;
  fVar148 = fVar145 * 0.0 + ((fVar169 * 0.5 + fVar148 * 0.0) - fVar124 * 0.5);
  fVar169 = fVar74 * 0.0 + ((fVar170 * 0.5 + fVar164 * 0.0) - fVar125 * 0.5);
  fVar170 = fVar104 * 0.0 + ((fVar175 * 0.5 + fVar165 * 0.0) - fVar126 * 0.5);
  fVar175 = fVar105 * 0.0 + ((fVar199 * 0.5 + fVar166 * 0.0) - fVar143 * 0.5);
  fVar124 = fVar216 * 0.0 + fVar201 * -0.0 + fVar255 + fVar241 * -0.0;
  fVar143 = fVar226 * 0.0 + fVar204 * -0.0 + fVar257 + fVar242 * -0.0;
  fVar164 = fVar228 * 0.0 + fVar214 * -0.0 + fVar307 + fVar260 * -0.0;
  fVar165 = fVar243 * 0.0 + fVar215 * -0.0 + fVar231 + fVar271 * -0.0;
  fVar145 = fVar201 * -0.0 + fVar216 + fVar255 * 0.0 + fVar241 * -0.0;
  fVar74 = fVar204 * -0.0 + fVar226 + fVar257 * 0.0 + fVar242 * -0.0;
  fVar104 = fVar214 * -0.0 + fVar228 + fVar307 * 0.0 + fVar260 * -0.0;
  fVar105 = fVar215 * -0.0 + fVar243 + fVar231 * 0.0 + fVar271 * -0.0;
  fVar126 = fVar241 * 0.0 + ((fVar201 * 0.5 + fVar216 * 0.0) - fVar255 * 0.5);
  fVar125 = fVar242 * 0.0 + ((fVar204 * 0.5 + fVar226 * 0.0) - fVar257 * 0.5);
  fVar199 = fVar260 * 0.0 + ((fVar214 * 0.5 + fVar228 * 0.0) - fVar307 * 0.5);
  fVar242 = fVar271 * 0.0 + ((fVar215 * 0.5 + fVar243 * 0.0) - fVar231 * 0.5);
  fVar243 = fVar318 * fVar124 - fVar143 * fVar314;
  fVar255 = fVar172 * fVar143 - fVar164 * fVar318;
  fVar257 = fVar314 * fVar164 - fVar124 * fVar172;
  fVar307 = fVar174 * fVar165 - fVar165 * fVar174;
  fVar166 = fVar318 * fVar262 - fVar273 * fVar314;
  fVar164 = fVar172 * fVar273 - fVar276 * fVar318;
  fVar165 = fVar314 * fVar276 - fVar262 * fVar172;
  fVar143 = fVar169 * fVar145 - fVar74 * fVar148;
  fVar204 = fVar170 * fVar74 - fVar104 * fVar169;
  fVar215 = fVar148 * fVar104 - fVar145 * fVar170;
  fVar226 = fVar175 * fVar105 - fVar105 * fVar175;
  fVar124 = fVar169 * fVar126 - fVar125 * fVar148;
  fVar125 = fVar170 * fVar125 - fVar199 * fVar169;
  fVar126 = fVar148 * fVar199 - fVar126 * fVar170;
  fVar105 = fVar257 * fVar257 + fVar255 * fVar255 + fVar243 * fVar243;
  auVar128 = ZEXT416((uint)fVar105);
  auVar75 = rsqrtss(ZEXT416((uint)fVar105),auVar128);
  fVar145 = auVar75._0_4_;
  fVar199 = fVar145 * 1.5 - fVar145 * fVar145 * fVar105 * 0.5 * fVar145;
  fVar145 = fVar243 * fVar166 + fVar257 * fVar165 + fVar255 * fVar164;
  auVar75 = rcpss(auVar128,auVar128);
  fVar74 = (2.0 - fVar105 * auVar75._0_4_) * auVar75._0_4_;
  fVar104 = fVar307 * fVar199;
  fVar260 = fVar215 * fVar215 + fVar204 * fVar204 + fVar143 * fVar143;
  auVar75 = ZEXT416((uint)fVar260);
  auVar128 = rsqrtss(ZEXT416((uint)fVar260),auVar75);
  fVar201 = auVar128._0_4_;
  fVar262 = fVar201 * 1.5 - fVar201 * fVar201 * fVar260 * 0.5 * fVar201;
  fVar273 = fVar143 * fVar124 + fVar215 * fVar126 + fVar204 * fVar125;
  auVar75 = rcpss(auVar75,auVar75);
  fVar276 = (2.0 - fVar260 * auVar75._0_4_) * auVar75._0_4_;
  fVar271 = fVar226 * fVar262;
  fVar201 = fVar304 * fVar255 * fVar199;
  fVar214 = fVar304 * fVar257 * fVar199;
  fVar216 = fVar304 * fVar243 * fVar199;
  fVar228 = fVar304 * fVar104;
  fVar164 = fVar304 * fVar74 * (fVar105 * fVar164 - fVar145 * fVar255) * fVar199 +
            fVar174 * fVar255 * fVar199;
  fVar165 = fVar304 * fVar74 * (fVar105 * fVar165 - fVar145 * fVar257) * fVar199 +
            fVar174 * fVar257 * fVar199;
  fVar166 = fVar304 * fVar74 * (fVar105 * fVar166 - fVar145 * fVar243) * fVar199 +
            fVar174 * fVar243 * fVar199;
  fVar199 = fVar304 * fVar74 * (fVar105 * (fVar174 * fVar278 - fVar278 * fVar174) -
                               fVar145 * fVar307) * fVar199 + fVar174 * fVar104;
  fVar243 = fVar274 - fVar201;
  fVar255 = fVar289 - fVar214;
  fVar257 = fVar293 - fVar216;
  fVar307 = fVar304 - fVar228;
  fVar201 = fVar201 + fVar274;
  fVar214 = fVar214 + fVar289;
  fVar216 = fVar216 + fVar293;
  fVar228 = fVar228 + fVar304;
  fVar145 = fVar203 * fVar204 * fVar262;
  fVar74 = fVar203 * fVar215 * fVar262;
  fVar104 = fVar203 * fVar143 * fVar262;
  fVar105 = fVar203 * fVar271;
  fVar204 = fVar203 * fVar276 * (fVar260 * fVar125 - fVar273 * fVar204) * fVar262 +
            fVar175 * fVar204 * fVar262;
  fVar231 = fVar203 * fVar276 * (fVar260 * fVar126 - fVar273 * fVar215) * fVar262 +
            fVar175 * fVar215 * fVar262;
  fVar241 = fVar203 * fVar276 * (fVar260 * fVar124 - fVar273 * fVar143) * fVar262 +
            fVar175 * fVar143 * fVar262;
  fVar226 = fVar203 * fVar276 * (fVar260 * (fVar175 * fVar242 - fVar242 * fVar175) -
                                fVar273 * fVar226) * fVar262 + fVar175 * fVar271;
  fVar124 = fVar176 - fVar145;
  fVar125 = fVar200 - fVar74;
  fVar126 = fVar202 - fVar104;
  fVar143 = fVar203 - fVar105;
  fVar145 = fVar145 + fVar176;
  fVar74 = fVar74 + fVar200;
  fVar104 = fVar104 + fVar202;
  fVar105 = fVar105 + fVar203;
  fVar215 = 1.0 - fVar103;
  local_378 = fVar261 * fVar215 + fVar243 * fVar103;
  fStack_374 = fVar272 * fVar215 + fVar255 * fVar103;
  fStack_370 = fVar275 * fVar215 + fVar257 * fVar103;
  fStack_36c = fVar277 * fVar215 + fVar307 * fVar103;
  local_388 = ((fVar317 - fVar244) * 0.33333334 + fVar261) * fVar215 +
              ((fVar314 - fVar164) * 0.33333334 + fVar243) * fVar103;
  fStack_384 = ((fVar144 - fVar256) * 0.33333334 + fVar272) * fVar215 +
               ((fVar318 - fVar165) * 0.33333334 + fVar255) * fVar103;
  fStack_380 = ((fVar146 - fVar258) * 0.33333334 + fVar275) * fVar215 +
               ((fVar172 - fVar166) * 0.33333334 + fVar257) * fVar103;
  fStack_37c = ((fVar147 - fVar259) * 0.33333334 + fVar277) * fVar215 +
               ((fVar174 - fVar199) * 0.33333334 + fVar307) * fVar103;
  local_398 = (fVar309 - (fVar306 - fVar280) * 0.33333334) * fVar215 +
              (fVar124 - (fVar148 - fVar204) * 0.33333334) * fVar103;
  fStack_394 = (fVar316 - (fVar308 - fVar290) * 0.33333334) * fVar215 +
               (fVar125 - (fVar169 - fVar231) * 0.33333334) * fVar103;
  fStack_390 = (fVar171 - (fVar313 - fVar292) * 0.33333334) * fVar215 +
               (fVar126 - (fVar170 - fVar241) * 0.33333334) * fVar103;
  fStack_38c = (fVar173 - (fVar315 - fVar294) * 0.33333334) * fVar215 +
               (fVar143 - (fVar175 - fVar226) * 0.33333334) * fVar103;
  local_3b8 = fVar309 * fVar215 + fVar124 * fVar103;
  fStack_3b4 = fVar316 * fVar215 + fVar125 * fVar103;
  fStack_3b0 = fVar171 * fVar215 + fVar126 * fVar103;
  fStack_3ac = fVar173 * fVar215 + fVar143 * fVar103;
  local_368 = fVar217 * fVar215 + fVar201 * fVar103;
  fStack_364 = fVar227 * fVar215 + fVar214 * fVar103;
  fStack_360 = fVar229 * fVar215 + fVar216 * fVar103;
  fStack_35c = fVar230 * fVar215 + fVar228 * fVar103;
  local_358 = ((fVar244 + fVar317) * 0.33333334 + fVar217) * fVar215 +
              ((fVar164 + fVar314) * 0.33333334 + fVar201) * fVar103;
  fStack_354 = ((fVar256 + fVar144) * 0.33333334 + fVar227) * fVar215 +
               ((fVar165 + fVar318) * 0.33333334 + fVar214) * fVar103;
  fStack_350 = ((fVar258 + fVar146) * 0.33333334 + fVar229) * fVar215 +
               ((fVar166 + fVar172) * 0.33333334 + fVar216) * fVar103;
  fStack_34c = ((fVar259 + fVar147) * 0.33333334 + fVar230) * fVar215 +
               ((fVar199 + fVar174) * 0.33333334 + fVar228) * fVar103;
  local_3cc.m128[1] =
       (fVar279 - (fVar280 + fVar306) * 0.33333334) * fVar215 +
       (fVar145 - (fVar204 + fVar148) * 0.33333334) * fVar103;
  local_3cc.m128[2] =
       (fVar291 - (fVar290 + fVar308) * 0.33333334) * fVar215 +
       (fVar74 - (fVar231 + fVar169) * 0.33333334) * fVar103;
  local_3cc.m128[3] =
       (fVar295 - (fVar292 + fVar313) * 0.33333334) * fVar215 +
       (fVar104 - (fVar241 + fVar170) * 0.33333334) * fVar103;
  fStack_3bc = (fVar305 - (fVar294 + fVar315) * 0.33333334) * fVar215 +
               (fVar105 - (fVar226 + fVar175) * 0.33333334) * fVar103;
  local_2b8 = fVar215 * fVar279 + fVar103 * fVar145;
  fStack_2b4 = fVar215 * fVar291 + fVar103 * fVar74;
  fStack_2b0 = fVar215 * fVar295 + fVar103 * fVar104;
  fStack_2ac = fVar215 * fVar305 + fVar103 * fVar105;
  fVar145 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar74 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar103 = (ray->super_RayK<1>).org.field_0.m128[2];
  fVar104 = (pre->ray_space).vx.field_0.m128[0];
  fVar105 = (pre->ray_space).vx.field_0.m128[1];
  fVar124 = (pre->ray_space).vy.field_0.m128[0];
  fVar125 = (pre->ray_space).vy.field_0.m128[1];
  fVar126 = (pre->ray_space).vz.field_0.m128[0];
  fVar143 = (pre->ray_space).vz.field_0.m128[1];
  local_308 = (local_378 - fVar145) * fVar104 +
              (fStack_374 - fVar74) * fVar124 + (fStack_370 - fVar103) * fVar126;
  fStack_304 = (local_378 - fVar145) * fVar105 +
               (fStack_374 - fVar74) * fVar125 + (fStack_370 - fVar103) * fVar143;
  local_208 = CONCAT44(fStack_304,local_308);
  fVar148 = (local_388 - fVar145) * fVar104 +
            (fStack_384 - fVar74) * fVar124 + (fStack_380 - fVar103) * fVar126;
  fVar164 = (local_388 - fVar145) * fVar105 +
            (fStack_384 - fVar74) * fVar125 + (fStack_380 - fVar103) * fVar143;
  local_218 = CONCAT44(fVar164,fVar148);
  fVar165 = (local_398 - fVar145) * fVar104 +
            (fStack_394 - fVar74) * fVar124 + (fStack_390 - fVar103) * fVar126;
  fVar166 = (local_398 - fVar145) * fVar105 +
            (fStack_394 - fVar74) * fVar125 + (fStack_390 - fVar103) * fVar143;
  local_228 = CONCAT44(fVar166,fVar165);
  fVar169 = (local_3b8 - fVar145) * fVar104 +
            (fStack_3b4 - fVar74) * fVar124 + (fStack_3b0 - fVar103) * fVar126;
  fVar170 = (local_3b8 - fVar145) * fVar105 +
            (fStack_3b4 - fVar74) * fVar125 + (fStack_3b0 - fVar103) * fVar143;
  local_238 = CONCAT44(fVar170,fVar169);
  fStack_300 = (local_368 - fVar145) * fVar104 +
               (fStack_364 - fVar74) * fVar124 + (fStack_360 - fVar103) * fVar126;
  fStack_2fc = (local_368 - fVar145) * fVar105 +
               (fStack_364 - fVar74) * fVar125 + (fStack_360 - fVar103) * fVar143;
  fVar175 = (local_358 - fVar145) * fVar104 +
            (fStack_354 - fVar74) * fVar124 + (fStack_350 - fVar103) * fVar126;
  fVar199 = (local_358 - fVar145) * fVar105 +
            (fStack_354 - fVar74) * fVar125 + (fStack_350 - fVar103) * fVar143;
  local_258 = CONCAT44(fVar199,fVar175);
  fVar201 = (local_3cc.m128[1] - fVar145) * fVar104 +
            (local_3cc.m128[2] - fVar74) * fVar124 + (local_3cc.m128[3] - fVar103) * fVar126;
  fVar204 = (local_3cc.m128[1] - fVar145) * fVar105 +
            (local_3cc.m128[2] - fVar74) * fVar125 + (local_3cc.m128[3] - fVar103) * fVar143;
  local_268 = CONCAT44(fVar204,fVar201);
  fVar104 = (local_2b8 - fVar145) * fVar104 +
            (fStack_2b4 - fVar74) * fVar124 + (fStack_2b0 - fVar103) * fVar126;
  fVar74 = (local_2b8 - fVar145) * fVar105 +
           (fStack_2b4 - fVar74) * fVar125 + (fStack_2b0 - fVar103) * fVar143;
  local_278 = CONCAT44(fVar74,fVar104);
  register0x000012c8 = local_258;
  local_318 = local_218;
  register0x00001388 = local_278;
  local_b8 = local_238;
  auVar95._8_4_ = fStack_300;
  auVar95._0_8_ = local_208;
  auVar95._12_4_ = fStack_2fc;
  auVar75 = minps(auVar95,_local_318);
  auVar117._8_4_ = fVar201;
  auVar117._0_8_ = local_228;
  auVar117._12_4_ = fVar204;
  auVar128 = minps(auVar117,_local_b8);
  auVar75 = minps(auVar75,auVar128);
  auVar118._4_4_ = fStack_304;
  auVar118._0_4_ = local_308;
  auVar118._8_4_ = fStack_300;
  auVar118._12_4_ = fStack_2fc;
  auVar128 = maxps(auVar118,_local_318);
  auVar129._4_4_ = fVar166;
  auVar129._0_4_ = fVar165;
  auVar129._8_4_ = fVar201;
  auVar129._12_4_ = fVar204;
  auVar130 = maxps(auVar129,_local_b8);
  auVar119 = maxps(auVar128,auVar130);
  auVar23._4_8_ = auVar130._8_8_;
  auVar23._0_4_ = auVar75._4_4_;
  auVar131._0_8_ = auVar23._0_8_ << 0x20;
  auVar131._8_4_ = auVar75._8_4_;
  auVar131._12_4_ = auVar75._12_4_;
  auVar132._8_8_ = auVar75._8_8_;
  auVar132._0_8_ = auVar131._8_8_;
  auVar128 = minps(auVar75,auVar132);
  auVar24._4_8_ = auVar75._8_8_;
  auVar24._0_4_ = auVar119._4_4_;
  auVar133._0_8_ = auVar24._0_8_ << 0x20;
  auVar133._8_4_ = auVar119._8_4_;
  auVar133._12_4_ = auVar119._12_4_;
  auVar134._8_8_ = auVar119._8_8_;
  auVar134._0_8_ = auVar133._8_8_;
  auVar75 = maxps(auVar119,auVar134);
  auVar96._0_8_ = auVar128._0_8_ & 0x7fffffff7fffffff;
  auVar96._8_4_ = auVar128._8_4_ & 0x7fffffff;
  auVar96._12_4_ = auVar128._12_4_ & 0x7fffffff;
  auVar120._0_8_ = auVar75._0_8_ & 0x7fffffff7fffffff;
  auVar120._8_4_ = auVar75._8_4_ & 0x7fffffff;
  auVar120._12_4_ = auVar75._12_4_ & 0x7fffffff;
  auVar75 = maxps(auVar96,auVar120);
  fVar145 = auVar75._4_4_;
  if (auVar75._4_4_ <= auVar75._0_4_) {
    fVar145 = auVar75._0_4_;
  }
  auVar66 = (undefined1  [8])((ulong)uVar68 + 0xf);
  fVar145 = fVar145 * 9.536743e-07;
  uStack_200 = local_208;
  uStack_210 = local_218;
  uStack_220 = local_228;
  uStack_230 = local_238;
  local_248 = CONCAT44(fStack_2fc,fStack_300);
  uStack_240 = CONCAT44(fStack_2fc,fStack_300);
  uStack_250 = local_258;
  uStack_260 = local_268;
  uStack_270 = local_278;
  local_148 = fVar145;
  fStack_144 = fVar145;
  fStack_140 = fVar145;
  fStack_13c = fVar145;
  local_158 = -fVar145;
  fStack_154 = -fVar145;
  fStack_150 = -fVar145;
  fStack_14c = -fVar145;
  local_88 = fVar148 - local_308;
  fStack_84 = fVar164 - fStack_304;
  fStack_80 = fVar175 - fStack_300;
  fStack_7c = fVar199 - fStack_2fc;
  local_98 = fVar165 - fVar148;
  fStack_94 = fVar166 - fVar164;
  fStack_90 = fVar201 - fVar175;
  fStack_8c = fVar204 - fVar199;
  local_a8 = fVar169 - fVar165;
  fStack_a4 = fVar170 - fVar166;
  fStack_a0 = fVar104 - fVar201;
  fStack_9c = fVar74 - fVar204;
  local_178 = local_368 - local_378;
  fStack_174 = fStack_364 - fStack_374;
  fStack_170 = fStack_360 - fStack_370;
  fStack_16c = fStack_35c - fStack_36c;
  local_188 = local_358 - local_388;
  fStack_184 = fStack_354 - fStack_384;
  fStack_180 = fStack_350 - fStack_380;
  fStack_17c = fStack_34c - fStack_37c;
  local_198 = local_3cc.m128[1] - local_398;
  fStack_194 = local_3cc.m128[2] - fStack_394;
  fStack_190 = local_3cc.m128[3] - fStack_390;
  fStack_18c = fStack_3bc - fStack_38c;
  local_1a8 = local_2b8 - local_3b8;
  fStack_1a4 = fStack_2b4 - fStack_3b4;
  fStack_1a0 = fStack_2b0 - fStack_3b0;
  fStack_19c = fStack_2ac - fStack_3ac;
  uVar58 = 0;
  local_418 = 0x3f80000000000000;
  local_408 = 0x3f80000000000000;
  local_328 = local_228;
  uStack_320 = local_268;
  do {
    fVar74 = 1.0 - (float)local_418;
    fVar103 = 1.0 - (float)local_418;
    fVar104 = 1.0 - local_418._4_4_;
    fVar105 = 1.0 - local_418._4_4_;
    fVar124 = (float)local_208 * fVar74 + (float)local_248 * (float)local_418;
    fVar169 = local_208._4_4_ * fVar103 + local_248._4_4_ * (float)local_418;
    fVar170 = (float)uStack_200 * fVar104 + (float)uStack_240 * local_418._4_4_;
    fVar175 = uStack_200._4_4_ * fVar105 + uStack_240._4_4_ * local_418._4_4_;
    fVar164 = (float)local_218 * fVar74 + (float)local_258 * (float)local_418;
    fVar215 = local_218._4_4_ * fVar103 + local_258._4_4_ * (float)local_418;
    fVar216 = (float)uStack_210 * fVar104 + (float)uStack_250 * local_418._4_4_;
    fVar226 = uStack_210._4_4_ * fVar105 + uStack_250._4_4_ * local_418._4_4_;
    fVar228 = (float)local_228 * fVar74 + (float)local_268 * (float)local_418;
    fVar243 = local_228._4_4_ * fVar103 + local_268._4_4_ * (float)local_418;
    fVar255 = (float)uStack_220 * fVar104 + (float)uStack_260 * local_418._4_4_;
    fVar257 = uStack_220._4_4_ * fVar105 + uStack_260._4_4_ * local_418._4_4_;
    fVar289 = fVar74 * (float)local_238 + (float)local_418 * (float)local_278;
    fVar291 = fVar103 * local_238._4_4_ + (float)local_418 * local_278._4_4_;
    fVar293 = fVar104 * (float)uStack_230 + local_418._4_4_ * (float)uStack_270;
    fVar295 = fVar105 * uStack_230._4_4_ + local_418._4_4_ * uStack_270._4_4_;
    fVar74 = (local_408._4_4_ - (float)local_408) * 0.11111111;
    fVar307 = (local_408._4_4_ - (float)local_408) * 0.0 + (float)local_408;
    fVar231 = (local_408._4_4_ - (float)local_408) * 0.33333334 + (float)local_408;
    fVar241 = (local_408._4_4_ - (float)local_408) * 0.6666667 + (float)local_408;
    fVar242 = (local_408._4_4_ - (float)local_408) * 1.0 + (float)local_408;
    fVar260 = 1.0 - fVar307;
    fVar271 = 1.0 - fVar231;
    fVar274 = 1.0 - fVar241;
    fVar279 = 1.0 - fVar242;
    fVar125 = fVar164 * fVar260 + fVar228 * fVar307;
    fVar126 = fVar164 * fVar271 + fVar228 * fVar231;
    fVar143 = fVar164 * fVar274 + fVar228 * fVar241;
    fVar148 = fVar164 * fVar279 + fVar228 * fVar242;
    fVar199 = fVar215 * fVar260 + fVar243 * fVar307;
    fVar201 = fVar215 * fVar271 + fVar243 * fVar231;
    fVar204 = fVar215 * fVar274 + fVar243 * fVar241;
    fVar214 = fVar215 * fVar279 + fVar243 * fVar242;
    fVar103 = (fVar124 * fVar260 + fVar164 * fVar307) * fVar260 + fVar307 * fVar125;
    fVar104 = (fVar124 * fVar271 + fVar164 * fVar231) * fVar271 + fVar231 * fVar126;
    fVar105 = (fVar124 * fVar274 + fVar164 * fVar241) * fVar274 + fVar241 * fVar143;
    fVar124 = (fVar124 * fVar279 + fVar164 * fVar242) * fVar279 + fVar242 * fVar148;
    fVar164 = (fVar169 * fVar260 + fVar215 * fVar307) * fVar260 + fVar307 * fVar199;
    fVar165 = (fVar169 * fVar271 + fVar215 * fVar231) * fVar271 + fVar231 * fVar201;
    fVar166 = (fVar169 * fVar274 + fVar215 * fVar241) * fVar274 + fVar241 * fVar204;
    fVar169 = (fVar169 * fVar279 + fVar215 * fVar242) * fVar279 + fVar242 * fVar214;
    fVar125 = fVar125 * fVar260 + (fVar228 * fVar260 + fVar289 * fVar307) * fVar307;
    fVar126 = fVar126 * fVar271 + (fVar228 * fVar271 + fVar289 * fVar231) * fVar231;
    fVar143 = fVar143 * fVar274 + (fVar228 * fVar274 + fVar289 * fVar241) * fVar241;
    fVar148 = fVar148 * fVar279 + (fVar228 * fVar279 + fVar289 * fVar242) * fVar242;
    fVar199 = fVar199 * fVar260 + (fVar243 * fVar260 + fVar291 * fVar307) * fVar307;
    fVar201 = fVar201 * fVar271 + (fVar243 * fVar271 + fVar291 * fVar231) * fVar231;
    fVar204 = fVar204 * fVar274 + (fVar243 * fVar274 + fVar291 * fVar241) * fVar241;
    fVar214 = fVar214 * fVar279 + (fVar243 * fVar279 + fVar291 * fVar242) * fVar242;
    local_2a8 = fVar260 * fVar103 + fVar307 * fVar125;
    fStack_2a4 = fVar271 * fVar104 + fVar231 * fVar126;
    fStack_2a0 = fVar274 * fVar105 + fVar241 * fVar143;
    fStack_29c = fVar279 * fVar124 + fVar242 * fVar148;
    local_298 = fVar260 * fVar164 + fVar307 * fVar199;
    fStack_294 = fVar271 * fVar165 + fVar231 * fVar201;
    fStack_290 = fVar274 * fVar166 + fVar241 * fVar204;
    fStack_28c = fVar279 * fVar169 + fVar242 * fVar214;
    fVar126 = (fVar126 - fVar104) * 3.0 * fVar74;
    fVar105 = (fVar143 - fVar105) * 3.0 * fVar74;
    fVar124 = (fVar148 - fVar124) * 3.0 * fVar74;
    fVar143 = (fVar201 - fVar165) * 3.0 * fVar74;
    fVar148 = (fVar204 - fVar166) * 3.0 * fVar74;
    fVar165 = (fVar214 - fVar169) * 3.0 * fVar74;
    local_e8._4_4_ = fStack_2a0;
    local_e8._0_4_ = fStack_2a4;
    local_c8._4_4_ = fStack_290;
    local_c8._0_4_ = fStack_294;
    local_3a8._0_4_ = local_2a8 + (fVar125 - fVar103) * 3.0 * fVar74;
    local_3a8._4_4_ = fStack_2a4 + fVar126;
    uStack_3a0._0_4_ = fStack_2a0 + fVar105;
    uStack_3a0._4_4_ = fStack_29c + fVar124;
    fVar103 = local_298 + (fVar199 - fVar164) * 3.0 * fVar74;
    fVar104 = fStack_294 + fVar143;
    fStack_420 = fStack_290 + fVar148;
    fStack_41c = fStack_28c + fVar165;
    local_288._0_4_ = fStack_2a4 - fVar126;
    local_288._4_4_ = fStack_2a0 - fVar105;
    local_288._8_4_ = fStack_29c - fVar124;
    local_288._12_4_ = 0;
    local_c8._8_4_ = fStack_28c;
    local_c8._12_4_ = 0;
    local_d8._0_4_ = fStack_294 - fVar143;
    local_d8._4_4_ = fStack_290 - fVar148;
    local_d8._8_4_ = fStack_28c - fVar165;
    local_d8._12_4_ = 0;
    fVar105 = fVar216 * fVar260 + fVar255 * fVar307;
    fVar124 = fVar216 * fVar271 + fVar255 * fVar231;
    fVar125 = fVar216 * fVar274 + fVar255 * fVar241;
    fVar126 = fVar216 * fVar279 + fVar255 * fVar242;
    fVar143 = fVar226 * fVar260 + fVar257 * fVar307;
    fVar148 = fVar226 * fVar271 + fVar257 * fVar231;
    fVar164 = fVar226 * fVar274 + fVar257 * fVar241;
    fVar165 = fVar226 * fVar279 + fVar257 * fVar242;
    fVar199 = (fVar170 * fVar260 + fVar216 * fVar307) * fVar260 + fVar307 * fVar105;
    fVar201 = (fVar170 * fVar271 + fVar216 * fVar231) * fVar271 + fVar231 * fVar124;
    fVar204 = (fVar170 * fVar274 + fVar216 * fVar241) * fVar274 + fVar241 * fVar125;
    fVar214 = (fVar170 * fVar279 + fVar216 * fVar242) * fVar279 + fVar242 * fVar126;
    fVar166 = (fVar175 * fVar260 + fVar226 * fVar307) * fVar260 + fVar307 * fVar143;
    fVar169 = (fVar175 * fVar271 + fVar226 * fVar231) * fVar271 + fVar231 * fVar148;
    fVar170 = (fVar175 * fVar274 + fVar226 * fVar241) * fVar274 + fVar241 * fVar164;
    fVar175 = (fVar175 * fVar279 + fVar226 * fVar242) * fVar279 + fVar242 * fVar165;
    fVar105 = fVar105 * fVar260 + (fVar255 * fVar260 + fVar293 * fVar307) * fVar307;
    fVar124 = fVar124 * fVar271 + (fVar255 * fVar271 + fVar293 * fVar231) * fVar231;
    fVar125 = fVar125 * fVar274 + (fVar255 * fVar274 + fVar293 * fVar241) * fVar241;
    fVar126 = fVar126 * fVar279 + (fVar255 * fVar279 + fVar293 * fVar242) * fVar242;
    fVar215 = fVar143 * fVar260 + (fVar257 * fVar260 + fVar295 * fVar307) * fVar307;
    fVar216 = fVar148 * fVar271 + (fVar257 * fVar271 + fVar295 * fVar231) * fVar231;
    fVar226 = fVar164 * fVar274 + (fVar257 * fVar274 + fVar295 * fVar241) * fVar241;
    fVar228 = fVar165 * fVar279 + (fVar257 * fVar279 + fVar295 * fVar242) * fVar242;
    fVar143 = fVar260 * fVar199 + fVar307 * fVar105;
    fVar148 = fVar271 * fVar201 + fVar231 * fVar124;
    fVar164 = fVar274 * fVar204 + fVar241 * fVar125;
    fVar165 = fVar279 * fVar214 + fVar242 * fVar126;
    fVar243 = fVar260 * fVar166 + fVar307 * fVar215;
    fVar255 = fVar271 * fVar169 + fVar231 * fVar216;
    fVar257 = fVar274 * fVar170 + fVar241 * fVar226;
    fVar307 = fVar279 * fVar175 + fVar242 * fVar228;
    fVar124 = (fVar124 - fVar201) * 3.0 * fVar74;
    fVar125 = (fVar125 - fVar204) * 3.0 * fVar74;
    fVar126 = (fVar126 - fVar214) * 3.0 * fVar74;
    fVar169 = (fVar216 - fVar169) * 3.0 * fVar74;
    fVar170 = (fVar226 - fVar170) * 3.0 * fVar74;
    fVar175 = (fVar228 - fVar175) * 3.0 * fVar74;
    local_f8._4_4_ = fVar164;
    local_f8._0_4_ = fVar148;
    local_f8._8_4_ = fVar165;
    local_f8._12_4_ = 0;
    local_118._4_4_ = fVar257;
    local_118._0_4_ = fVar255;
    local_118._8_4_ = fVar307;
    local_118._12_4_ = 0;
    local_338 = fVar143 + (fVar105 - fVar199) * 3.0 * fVar74;
    fStack_334 = fVar148 + fVar124;
    fStack_330 = fVar164 + fVar125;
    fStack_32c = fVar165 + fVar126;
    local_108 = fVar243 + (fVar215 - fVar166) * 3.0 * fVar74;
    fStack_104 = fVar255 + fVar169;
    fStack_100 = fVar257 + fVar170;
    fStack_fc = fVar307 + fVar175;
    local_138._0_4_ = fVar148 - fVar124;
    local_138._4_4_ = fVar164 - fVar125;
    local_138._8_4_ = fVar165 - fVar126;
    local_138._12_4_ = 0;
    local_128._0_4_ = fVar255 - fVar169;
    local_128._4_4_ = fVar257 - fVar170;
    local_128._8_4_ = fVar307 - fVar175;
    local_128._12_4_ = 0;
    local_e8._8_4_ = fStack_29c;
    local_e8._12_4_ = 0;
    fVar126 = (fVar148 - fStack_2a4) + (fVar143 - local_2a8);
    fVar166 = (fVar164 - fStack_2a0) + (fVar148 - fStack_2a4);
    fVar169 = (fVar165 - fStack_29c) + (fVar164 - fStack_2a0);
    fVar170 = (fVar165 - fStack_29c) + 0.0;
    fVar74 = (fVar255 - fStack_294) + (fVar243 - local_298);
    fVar105 = (fVar257 - fStack_290) + (fVar255 - fStack_294);
    fVar124 = (fVar307 - fStack_28c) + (fVar257 - fStack_290);
    fVar125 = (fVar307 - fStack_28c) + 0.0;
    auVar193._0_8_ =
         CONCAT44(fStack_294 * fVar166 - fStack_2a4 * fVar105,
                  local_298 * fVar126 - local_2a8 * fVar74);
    auVar193._8_4_ = fStack_290 * fVar169 - fStack_2a0 * fVar124;
    auVar193._12_4_ = fStack_28c * fVar170 - fStack_29c * fVar125;
    auVar135._0_4_ = fVar103 * fVar126 - (float)local_3a8._0_4_ * fVar74;
    auVar135._4_4_ = fVar104 * fVar166 - (float)local_3a8._4_4_ * fVar105;
    auVar135._8_4_ = fStack_420 * fVar169 - (float)uStack_3a0 * fVar124;
    auVar135._12_4_ = fStack_41c * fVar170 - uStack_3a0._4_4_ * fVar125;
    auVar154._0_8_ =
         CONCAT44(local_d8._4_4_ * fVar166 - fVar105 * local_288._4_4_,
                  local_d8._0_4_ * fVar126 - fVar74 * local_288._0_4_);
    auVar154._8_4_ = local_d8._8_4_ * fVar169 - fVar124 * local_288._8_4_;
    auVar154._12_4_ = fVar170 * 0.0 - fVar125 * 0.0;
    auVar326._0_4_ = fVar126 * fStack_294 - fVar74 * fStack_2a4;
    auVar326._4_4_ = fVar166 * fStack_290 - fVar105 * fStack_2a0;
    auVar326._8_4_ = fVar169 * fStack_28c - fVar124 * fStack_29c;
    auVar326._12_4_ = fVar170 * 0.0 - fVar125 * 0.0;
    auVar97._0_8_ =
         CONCAT44(fVar255 * fVar166 - fVar148 * fVar105,fVar243 * fVar126 - fVar143 * fVar74);
    auVar97._8_4_ = fVar257 * fVar169 - fVar164 * fVar124;
    auVar97._12_4_ = fVar307 * fVar170 - fVar165 * fVar125;
    auVar286._0_4_ = local_108 * fVar126 - local_338 * fVar74;
    auVar286._4_4_ = fStack_104 * fVar166 - fStack_334 * fVar105;
    auVar286._8_4_ = fStack_100 * fVar169 - fStack_330 * fVar124;
    auVar286._12_4_ = fStack_fc * fVar170 - fStack_32c * fVar125;
    auVar232._0_8_ =
         CONCAT44(local_128._4_4_ * fVar166 - fVar105 * local_138._4_4_,
                  local_128._0_4_ * fVar126 - fVar74 * local_138._0_4_);
    auVar232._8_4_ = local_128._8_4_ * fVar169 - fVar124 * local_138._8_4_;
    auVar232._12_4_ = fVar170 * 0.0 - fVar125 * 0.0;
    auVar267._0_4_ = fVar126 * fVar255 - fVar74 * fVar148;
    auVar267._4_4_ = fVar166 * fVar257 - fVar105 * fVar164;
    auVar267._8_4_ = fVar169 * fVar307 - fVar124 * fVar165;
    auVar267._12_4_ = fVar170 * 0.0 - fVar125 * 0.0;
    auVar319._8_4_ = auVar193._8_4_;
    auVar319._0_8_ = auVar193._0_8_;
    auVar319._12_4_ = auVar193._12_4_;
    auVar119 = minps(auVar319,auVar135);
    auVar128 = maxps(auVar193,auVar135);
    auVar136._8_4_ = auVar154._8_4_;
    auVar136._0_8_ = auVar154._0_8_;
    auVar136._12_4_ = auVar154._12_4_;
    auVar75 = minps(auVar136,auVar326);
    auVar320 = minps(auVar119,auVar75);
    auVar75 = maxps(auVar154,auVar326);
    auVar130 = maxps(auVar128,auVar75);
    auVar137._8_4_ = auVar97._8_4_;
    auVar137._0_8_ = auVar97._0_8_;
    auVar137._12_4_ = auVar97._12_4_;
    auVar128 = minps(auVar137,auVar286);
    auVar75 = maxps(auVar97,auVar286);
    auVar155._8_4_ = auVar232._8_4_;
    auVar155._0_8_ = auVar232._0_8_;
    auVar155._12_4_ = auVar232._12_4_;
    auVar119 = minps(auVar155,auVar267);
    auVar128 = minps(auVar128,auVar119);
    auVar119 = minps(auVar320,auVar128);
    auVar128 = maxps(auVar232,auVar267);
    auVar75 = maxps(auVar75,auVar128);
    auVar75 = maxps(auVar130,auVar75);
    bVar67 = auVar119._4_4_ <= fStack_144;
    bVar21 = auVar119._8_4_ <= fStack_140;
    bVar22 = auVar119._12_4_ <= fStack_13c;
    auVar55._4_4_ = -(uint)bVar21;
    auVar55._0_4_ = -(uint)bVar67;
    auVar55._8_4_ = -(uint)bVar22;
    auVar55._12_4_ = 0;
    auVar322 = auVar55 << 0x20;
    auVar194._0_4_ =
         -(uint)(local_158 <= auVar75._0_4_ && auVar119._0_4_ <= local_148) & local_168._0_4_;
    auVar194._4_4_ = -(uint)(fStack_154 <= auVar75._4_4_ && bVar67) & local_168._4_4_;
    auVar194._8_4_ = -(uint)(fStack_150 <= auVar75._8_4_ && bVar21) & local_168._8_4_;
    auVar194._12_4_ = -(uint)(fStack_14c <= auVar75._12_4_ && bVar22) & local_168._12_4_;
    iVar61 = movmskps((int)pRVar62,auVar194);
    paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0x0;
    if (iVar61 != 0) {
      fVar126 = (fVar148 - fVar143) + (fStack_2a4 - local_2a8);
      fVar166 = (fVar164 - fVar148) + (fStack_2a0 - fStack_2a4);
      fVar169 = (fVar165 - fVar164) + (fStack_29c - fStack_2a0);
      fVar170 = (0.0 - fVar165) + (0.0 - fStack_29c);
      fVar74 = (fVar255 - fVar243) + (fStack_294 - local_298);
      fVar105 = (fVar257 - fVar255) + (fStack_290 - fStack_294);
      fVar124 = (fVar307 - fVar257) + (fStack_28c - fStack_290);
      fVar125 = (0.0 - fVar307) + (0.0 - fStack_28c);
      auVar327._0_8_ =
           CONCAT44(fStack_294 * fVar166 - fStack_2a4 * fVar105,
                    local_298 * fVar126 - local_2a8 * fVar74);
      auVar327._8_4_ = fStack_290 * fVar169 - fStack_2a0 * fVar124;
      auVar327._12_4_ = fStack_28c * fVar170 - fStack_29c * fVar125;
      auVar138._0_4_ = fVar103 * fVar126 - (float)local_3a8._0_4_ * fVar74;
      auVar138._4_4_ = fVar104 * fVar166 - (float)local_3a8._4_4_ * fVar105;
      auVar138._8_4_ = fStack_420 * fVar169 - (float)uStack_3a0 * fVar124;
      auVar138._12_4_ = fStack_41c * fVar170 - uStack_3a0._4_4_ * fVar125;
      auVar322._0_4_ = local_288._0_4_ * fVar74;
      auVar322._4_4_ = local_288._4_4_ * fVar105;
      auVar322._8_4_ = local_288._8_4_ * fVar124;
      auVar322._12_4_ = fVar125 * 0.0;
      auVar223._0_8_ =
           CONCAT44(local_d8._4_4_ * fVar166 - auVar322._4_4_,
                    local_d8._0_4_ * fVar126 - auVar322._0_4_);
      auVar223._8_4_ = local_d8._8_4_ * fVar169 - auVar322._8_4_;
      auVar223._12_4_ = fVar170 * 0.0 - auVar322._12_4_;
      auVar156._0_4_ = fStack_294 * fVar126 - fStack_2a4 * fVar74;
      auVar156._4_4_ = fStack_290 * fVar166 - fStack_2a0 * fVar105;
      auVar156._8_4_ = fStack_28c * fVar169 - fStack_29c * fVar124;
      auVar156._12_4_ = fVar170 * 0.0 - fVar125 * 0.0;
      auVar310._0_8_ =
           CONCAT44(fVar255 * fVar166 - fVar148 * fVar105,fVar243 * fVar126 - fVar143 * fVar74);
      auVar310._8_4_ = fVar257 * fVar169 - fVar164 * fVar124;
      auVar310._12_4_ = fVar307 * fVar170 - fVar165 * fVar125;
      auVar167._0_4_ = local_108 * fVar126 - local_338 * fVar74;
      auVar167._4_4_ = fStack_104 * fVar166 - fStack_334 * fVar105;
      auVar167._8_4_ = fStack_100 * fVar169 - fStack_330 * fVar124;
      auVar167._12_4_ = fStack_fc * fVar170 - fStack_32c * fVar125;
      auVar287._0_8_ =
           CONCAT44(local_128._4_4_ * fVar166 - local_138._4_4_ * fVar105,
                    local_128._0_4_ * fVar126 - local_138._0_4_ * fVar74);
      auVar287._8_4_ = local_128._8_4_ * fVar169 - local_138._8_4_ * fVar124;
      auVar287._12_4_ = fVar170 * 0.0 - fVar125 * 0.0;
      auVar268._0_4_ = fVar126 * fVar255 - fVar74 * fVar148;
      auVar268._4_4_ = fVar166 * fVar257 - fVar105 * fVar164;
      auVar268._8_4_ = fVar169 * fVar307 - fVar124 * fVar165;
      auVar268._12_4_ = fVar170 * 0.0 - fVar125 * 0.0;
      auVar98._8_4_ = auVar327._8_4_;
      auVar98._0_8_ = auVar327._0_8_;
      auVar98._12_4_ = auVar327._12_4_;
      auVar75 = minps(auVar98,auVar138);
      auVar119 = maxps(auVar327,auVar138);
      auVar139._8_4_ = auVar223._8_4_;
      auVar139._0_8_ = auVar223._0_8_;
      auVar139._12_4_ = auVar223._12_4_;
      auVar128 = minps(auVar139,auVar156);
      auVar75 = minps(auVar75,auVar128);
      auVar128 = maxps(auVar223,auVar156);
      auVar320 = maxps(auVar119,auVar128);
      auVar140._8_4_ = auVar310._8_4_;
      auVar140._0_8_ = auVar310._0_8_;
      auVar140._12_4_ = auVar310._12_4_;
      auVar128 = minps(auVar140,auVar167);
      auVar130 = maxps(auVar310,auVar167);
      auVar157._8_4_ = auVar287._8_4_;
      auVar157._0_8_ = auVar287._0_8_;
      auVar157._12_4_ = auVar287._12_4_;
      auVar119 = minps(auVar157,auVar268);
      auVar128 = minps(auVar128,auVar119);
      auVar75 = minps(auVar75,auVar128);
      auVar128 = maxps(auVar287,auVar268);
      auVar128 = maxps(auVar130,auVar128);
      auVar128 = maxps(auVar320,auVar128);
      auVar328._0_4_ =
           -(uint)(local_158 <= auVar128._0_4_ && auVar75._0_4_ <= local_148) & auVar194._0_4_;
      auVar328._4_4_ =
           -(uint)(fStack_154 <= auVar128._4_4_ && auVar75._4_4_ <= fStack_144) & auVar194._4_4_;
      auVar328._8_4_ =
           -(uint)(fStack_150 <= auVar128._8_4_ && auVar75._8_4_ <= fStack_140) & auVar194._8_4_;
      auVar328._12_4_ =
           -(uint)(fStack_14c <= auVar128._12_4_ && auVar75._12_4_ <= fStack_13c) & auVar194._12_4_;
      uVar71 = movmskps(0,auVar328);
      paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar71;
    }
    if ((uint)paVar59 != 0) {
      auStack_1f8[uVar58] = (uint)paVar59;
      *(undefined8 *)(afStack_78 + uVar58 * 2) = local_408;
      auStack_58[uVar58] = local_418;
      uVar58 = (ulong)((int)uVar58 + 1);
    }
    do {
      if ((int)uVar58 == 0) {
        fVar145 = (ray->super_RayK<1>).tfar;
        auVar123._4_4_ = -(uint)(fStack_1b4 <= fVar145);
        auVar123._0_4_ = -(uint)(local_1b8 <= fVar145);
        auVar123._8_4_ = -(uint)(fStack_1b0 <= fVar145);
        auVar123._12_4_ = -(uint)(fStack_1ac <= fVar145);
        uVar69 = movmskps((int)paVar59,auVar123);
        uVar68 = uVar68 & SUB84(auVar66,0) & uVar69;
        if (uVar68 == 0) {
          return;
        }
        goto LAB_00c31d4c;
      }
      uVar72 = (int)uVar58 - 1;
      uVar60 = (ulong)uVar72;
      uVar71 = auStack_1f8[uVar60];
      local_418 = auStack_58[uVar60];
      uVar5 = 0;
      if (uVar71 != 0) {
        for (; (uVar71 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar71 = uVar71 - 1 & uVar71;
      auStack_1f8[uVar60] = uVar71;
      if (uVar71 == 0) {
        uVar58 = (ulong)uVar72;
      }
      pRVar63 = (RTCIntersectArguments *)(uVar5 + 1);
      pRVar62 = pRVar63;
      if ((long)pRVar63 < 0) {
        pRVar62 = (RTCIntersectArguments *)((ulong)((uint)pRVar63 & 1) | (ulong)pRVar63 >> 1);
      }
      fVar74 = afStack_78[uVar60 * 2];
      fVar103 = *(float *)((long)auStack_58 + uVar60 * 8 + -0x1c);
      fVar104 = fVar74 * (1.0 - (float)uVar5 * 0.33333334) + fVar103 * (float)uVar5 * 0.33333334;
      fVar105 = fVar74 * (1.0 - (float)pRVar63 * 0.33333334) + fVar103 * (float)pRVar63 * 0.33333334
      ;
      fVar124 = fVar74 * 0.0 + fVar103 * 0.0;
      fVar103 = fVar74 * 0.0 + fVar103 * 0.0;
      fVar74 = fVar105 - fVar104;
      local_408 = CONCAT44(fVar105,fVar104);
      if (0.16666667 <= fVar74) break;
      fVar125 = (float)local_418;
      fVar126 = (float)((ulong)local_418 >> 0x20);
      fVar143 = 1.0 - fVar125;
      fVar148 = 1.0 - fVar125;
      fVar199 = 1.0 - fVar126;
      fVar201 = 1.0 - fVar126;
      fVar164 = (float)local_208 * fVar143 + (float)local_248 * fVar125;
      fVar165 = local_208._4_4_ * fVar148 + local_248._4_4_ * fVar125;
      fVar166 = (float)uStack_200 * fVar199 + (float)uStack_240 * fVar126;
      fVar169 = uStack_200._4_4_ * fVar201 + uStack_240._4_4_ * fVar126;
      fVar204 = (float)local_218 * fVar143 + (float)local_258 * fVar125;
      fVar214 = local_218._4_4_ * fVar148 + local_258._4_4_ * fVar125;
      fVar215 = (float)uStack_210 * fVar199 + (float)uStack_250 * fVar126;
      fVar216 = uStack_210._4_4_ * fVar201 + uStack_250._4_4_ * fVar126;
      fVar226 = (float)local_228 * fVar143 + (float)local_268 * fVar125;
      fVar243 = local_228._4_4_ * fVar148 + local_268._4_4_ * fVar125;
      fVar257 = (float)uStack_220 * fVar199 + (float)uStack_260 * fVar126;
      fVar231 = uStack_220._4_4_ * fVar201 + uStack_260._4_4_ * fVar126;
      fVar170 = (fVar143 * (float)local_238 + fVar125 * (float)local_278) - fVar226;
      fVar175 = (fVar148 * local_238._4_4_ + fVar125 * local_278._4_4_) - fVar243;
      fVar199 = (fVar199 * (float)uStack_230 + fVar126 * (float)uStack_270) - fVar257;
      fVar201 = (fVar201 * uStack_230._4_4_ + fVar126 * uStack_270._4_4_) - fVar231;
      fVar125 = fVar104 * (fVar226 - fVar204) + fVar204;
      fVar126 = fVar104 * (fVar243 - fVar214) + fVar214;
      fVar143 = fVar104 * (fVar257 - fVar215) + fVar215;
      fVar148 = fVar104 * (fVar231 - fVar216) + fVar216;
      fVar228 = (fVar226 - fVar204) * fVar105 + fVar204;
      fVar255 = (fVar243 - fVar214) * fVar105 + fVar214;
      fVar307 = (fVar257 - fVar215) * fVar105 + fVar215;
      fVar241 = (fVar231 - fVar216) * fVar105 + fVar216;
      fVar242 = fVar104 * (fVar204 - fVar164) + fVar164;
      fVar260 = fVar104 * (fVar214 - fVar165) + fVar165;
      fVar271 = fVar104 * (fVar215 - fVar166) + fVar166;
      fVar274 = fVar104 * (fVar216 - fVar169) + fVar169;
      fVar242 = (fVar125 - fVar242) * fVar104 + fVar242;
      fVar260 = (fVar126 - fVar260) * fVar104 + fVar260;
      fVar271 = (fVar143 - fVar271) * fVar104 + fVar271;
      fVar274 = (fVar148 - fVar274) * fVar104 + fVar274;
      fVar125 = (((fVar104 * fVar170 + fVar226) - fVar125) * fVar104 + fVar125) - fVar242;
      fVar126 = (((fVar104 * fVar175 + fVar243) - fVar126) * fVar104 + fVar126) - fVar260;
      fVar143 = (((fVar104 * fVar199 + fVar257) - fVar143) * fVar104 + fVar143) - fVar271;
      fVar148 = (((fVar104 * fVar201 + fVar231) - fVar148) * fVar104 + fVar148) - fVar274;
      auVar99._0_4_ = fVar104 * fVar125 + fVar242;
      auVar99._4_4_ = fVar104 * fVar126 + fVar260;
      auVar99._8_4_ = fVar104 * fVar143 + fVar271;
      auVar99._12_4_ = fVar104 * fVar148 + fVar274;
      fVar164 = (fVar204 - fVar164) * fVar105 + fVar164;
      fVar165 = (fVar214 - fVar165) * fVar105 + fVar165;
      fVar166 = (fVar215 - fVar166) * fVar105 + fVar166;
      fVar169 = (fVar216 - fVar169) * fVar105 + fVar169;
      fVar164 = (fVar228 - fVar164) * fVar105 + fVar164;
      fVar165 = (fVar255 - fVar165) * fVar105 + fVar165;
      fVar166 = (fVar307 - fVar166) * fVar105 + fVar166;
      fVar169 = (fVar241 - fVar169) * fVar105 + fVar169;
      fVar204 = (((fVar170 * fVar105 + fVar226) - fVar228) * fVar105 + fVar228) - fVar164;
      fVar214 = (((fVar175 * fVar105 + fVar243) - fVar255) * fVar105 + fVar255) - fVar165;
      fVar215 = (((fVar199 * fVar105 + fVar257) - fVar307) * fVar105 + fVar307) - fVar166;
      fVar216 = (((fVar201 * fVar105 + fVar231) - fVar241) * fVar105 + fVar241) - fVar169;
      fVar164 = fVar105 * fVar204 + fVar164;
      fVar165 = fVar105 * fVar214 + fVar165;
      fVar166 = fVar105 * fVar215 + fVar166;
      fVar169 = fVar105 * fVar216 + fVar169;
      fVar226 = fVar74 * 0.33333334;
      fVar170 = fVar125 * 3.0 * fVar226 + auVar99._0_4_;
      fVar175 = fVar126 * 3.0 * fVar226 + auVar99._4_4_;
      fVar199 = fVar143 * 3.0 * fVar226 + auVar99._8_4_;
      fVar201 = fVar148 * 3.0 * fVar226 + auVar99._12_4_;
      fVar204 = fVar164 - fVar226 * fVar204 * 3.0;
      fVar214 = fVar165 - fVar226 * fVar214 * 3.0;
      fVar215 = fVar166 - fVar226 * fVar215 * 3.0;
      fVar216 = fVar169 - fVar226 * fVar216 * 3.0;
      auVar25._4_8_ = auVar322._8_8_;
      auVar25._0_4_ = auVar99._4_4_;
      auVar321._0_8_ = auVar25._0_8_ << 0x20;
      auVar321._8_4_ = auVar99._8_4_;
      auVar321._12_4_ = auVar99._12_4_;
      auVar322._8_8_ = auVar99._8_8_;
      auVar322._0_8_ = auVar321._8_8_;
      fVar255 = (fVar166 - fVar164) + (auVar99._8_4_ - auVar99._0_4_);
      fVar257 = (fVar169 - fVar165) + (auVar99._12_4_ - auVar99._4_4_);
      auVar233._0_4_ = fVar257 * fVar165;
      auVar233._4_4_ = fVar257 * fVar165;
      auVar233._8_4_ = fVar257 * fVar169;
      auVar233._12_4_ = fVar257 * fVar169;
      fVar125 = auVar99._0_4_ * fVar255 + auVar99._4_4_ * fVar257;
      fVar126 = auVar99._8_4_ * fVar255 + auVar99._12_4_ * fVar257;
      fVar307 = fVar170 * fVar255 + fVar175 * fVar257;
      fVar231 = fVar199 * fVar255 + fVar201 * fVar257;
      fVar226 = fVar204 * fVar255 + fVar214 * fVar257;
      auVar249._4_4_ = fVar214 * fVar255 + fVar214 * fVar257;
      auVar249._0_4_ = fVar226;
      fVar228 = fVar215 * fVar255 + fVar216 * fVar257;
      fVar143 = fVar255 * fVar164 + auVar233._0_4_;
      fVar243 = fVar255 * fVar166 + auVar233._8_4_;
      auVar26._4_8_ = auVar233._8_8_;
      auVar26._0_4_ = fVar175 * fVar255 + fVar175 * fVar257;
      auVar234._0_8_ = auVar26._0_8_ << 0x20;
      auVar234._8_4_ = fVar231;
      auVar234._12_4_ = fVar201 * fVar255 + fVar201 * fVar257;
      fVar148 = fVar307;
      if (fVar307 <= fVar125) {
        fVar148 = fVar125;
        fVar125 = fVar307;
      }
      auVar235._8_8_ = auVar234._8_8_;
      auVar235._0_8_ = auVar235._8_8_;
      auVar249._8_4_ = fVar228;
      auVar249._12_4_ = fVar216 * fVar255 + fVar216 * fVar257;
      if (fVar143 <= fVar226) {
        auVar249._0_4_ = fVar143;
      }
      if (auVar249._0_4_ <= fVar125) {
        fVar125 = auVar249._0_4_;
      }
      auVar27._4_8_ = auVar249._8_8_;
      auVar27._0_4_ = fVar255 * fVar165 + auVar233._4_4_;
      auVar250._0_8_ = auVar27._0_8_ << 0x20;
      auVar250._8_4_ = fVar243;
      auVar250._12_4_ = fVar255 * fVar169 + auVar233._12_4_;
      if (fVar143 <= fVar226) {
        fVar143 = fVar226;
      }
      auVar251._8_8_ = auVar250._8_8_;
      auVar251._0_8_ = auVar251._8_8_;
      if (fVar143 <= fVar148) {
        fVar143 = fVar148;
      }
      if (fVar231 <= fVar126) {
        auVar235._0_4_ = fVar126;
        fVar126 = fVar231;
      }
      fVar148 = fVar228;
      if (fVar243 <= fVar228) {
        fVar148 = fVar243;
      }
      if (fVar148 <= fVar126) {
        fVar126 = fVar148;
      }
      if (fVar243 <= fVar228) {
        auVar251._0_4_ = fVar228;
      }
      if (auVar251._0_4_ <= auVar235._0_4_) {
        auVar251._0_4_ = auVar235._0_4_;
      }
      bVar67 = 3 < (uint)uVar58;
      uVar28 = (undefined3)(uVar72 >> 8);
      fVar148 = auVar251._0_4_;
      if ((0.0001 <= fVar125) || (fVar148 <= -0.0001)) {
        if ((-0.0001 < fVar143 && fVar126 < 0.0001) ||
           ((fVar125 < 0.0001 && -0.0001 < fVar143 || (fVar126 < 0.0001 && -0.0001 < fVar148))))
        goto LAB_00c334eb;
        bVar21 = true;
        paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar28,bVar67);
        pRVar62 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar62 >> 8),fVar74 < 0.001);
      }
      else {
LAB_00c334eb:
        _local_3a8 = auVar322;
        local_418 = CONCAT44(fVar169,fVar166);
        bVar67 = bVar67 || fVar74 < 0.001;
        paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar28,bVar67);
        fVar243 = (float)(~-(uint)(fVar125 < 0.0) & 0x3f800000 | -(uint)(fVar125 < 0.0) & 0xbf800000
                         );
        fVar228 = (float)(~-(uint)(fVar143 < 0.0) & 0x3f800000 | -(uint)(fVar143 < 0.0) & 0xbf800000
                         );
        fVar226 = 0.0;
        if ((fVar243 == fVar228) && (!NAN(fVar243) && !NAN(fVar228))) {
          fVar226 = INFINITY;
        }
        fVar255 = 0.0;
        if ((fVar243 == fVar228) && (!NAN(fVar243) && !NAN(fVar228))) {
          fVar255 = -INFINITY;
        }
        fVar257 = (float)(~-(uint)(fVar126 < 0.0) & 0x3f800000 | -(uint)(fVar126 < 0.0) & 0xbf800000
                         );
        if ((fVar243 != fVar257) || (fVar307 = fVar255, NAN(fVar243) || NAN(fVar257))) {
          if ((fVar126 != fVar125) || (NAN(fVar126) || NAN(fVar125))) {
            fVar126 = -fVar125 / (fVar126 - fVar125);
            fVar126 = (1.0 - fVar126) * 0.0 + fVar126;
            fVar307 = fVar126;
          }
          else {
            fVar126 = INFINITY;
            if ((fVar125 == 0.0) && (fVar126 = INFINITY, !NAN(fVar125))) {
              fVar126 = 0.0;
            }
            fVar307 = *(float *)(&DAT_01ff1ec4 + (ulong)(-(uint)(fVar125 == 0.0) & 1) * 4);
          }
          if (fVar126 <= fVar226) {
            fVar226 = fVar126;
          }
          if (fVar307 <= fVar255) {
            fVar307 = fVar255;
          }
        }
        pRVar62 = (RTCIntersectArguments *)(ulong)(fVar148 < 0.0);
        fVar125 = *(float *)(&DAT_01ff1ecc + (long)pRVar62 * 4);
        if ((fVar228 != fVar125) || (fVar126 = fVar307, NAN(fVar228) || NAN(fVar125))) {
          if ((fVar148 != fVar143) || (NAN(fVar148) || NAN(fVar143))) {
            fVar148 = -fVar143 / (fVar148 - fVar143);
            fVar148 = (1.0 - fVar148) * 0.0 + fVar148;
            fVar126 = fVar148;
          }
          else {
            fVar148 = INFINITY;
            if ((fVar143 == 0.0) && (fVar148 = INFINITY, !NAN(fVar143))) {
              fVar148 = 0.0;
            }
            pRVar62 = (RTCIntersectArguments *)(ulong)(-(uint)(fVar143 == 0.0) & 1);
            fVar126 = *(float *)(&DAT_01ff1ec4 + (long)pRVar62 * 4);
          }
          if (fVar148 <= fVar226) {
            fVar226 = fVar148;
          }
          if (fVar126 <= fVar307) {
            fVar126 = fVar307;
          }
        }
        auVar322 = ZEXT816(0x3f80000000000000);
        if ((fVar257 != fVar125) || (NAN(fVar257) || NAN(fVar125))) {
          fVar226 = (float)(~-(uint)(fVar226 < 1.0) & 0x3f800000 |
                           (uint)fVar226 & -(uint)(fVar226 < 1.0));
          fVar126 = (float)(~-(uint)(fVar126 < 1.0) & (uint)fVar126 |
                           -(uint)(fVar126 < 1.0) & 0x3f800000);
        }
        uVar71 = -(uint)(fVar126 < auVar322._4_4_);
        fVar226 = (float)(~-(uint)(fVar226 < 0.0) & (uint)fVar226);
        fVar125 = (float)(~uVar71 & 0x3f800000 | (uint)fVar126 & uVar71);
        bVar21 = true;
        if (fVar226 <= fVar125) {
          fVar226 = fVar226 + -0.1;
          fVar125 = fVar125 + 0.1;
          uVar71 = -(uint)(fVar125 < auVar322._4_4_);
          fVar226 = (float)(~-(uint)(fVar226 < 0.0) & (uint)fVar226);
          fVar241 = (float)(~uVar71 & 0x3f800000 | (uint)fVar125 & uVar71);
          fVar255 = 1.0 - fVar226;
          fVar257 = 1.0 - fVar226;
          fVar307 = 1.0 - fVar241;
          fVar231 = 1.0 - fVar241;
          fVar125 = auVar99._0_4_ * fVar255 + auVar99._8_4_ * fVar226;
          fVar126 = auVar99._4_4_ * fVar257 + auVar99._12_4_ * fVar226;
          fVar143 = auVar99._0_4_ * fVar307 + auVar99._8_4_ * fVar241;
          fVar148 = auVar99._4_4_ * fVar231 + auVar99._12_4_ * fVar241;
          fVar228 = fVar170 * fVar255 + fVar199 * fVar226;
          fVar243 = fVar175 * fVar257 + fVar201 * fVar226;
          fVar170 = fVar170 * fVar307 + fVar199 * fVar241;
          fVar175 = fVar175 * fVar231 + fVar201 * fVar241;
          fVar199 = fVar204 * fVar255 + fVar215 * fVar226;
          fVar201 = fVar214 * fVar257 + fVar216 * fVar226;
          fVar204 = fVar204 * fVar307 + fVar215 * fVar241;
          fVar214 = fVar214 * fVar231 + fVar216 * fVar241;
          fVar215 = fVar255 * fVar164 + fVar166 * fVar226;
          fVar216 = fVar257 * fVar165 + fVar169 * fVar226;
          fVar164 = fVar307 * fVar164 + fStack_420 * fVar241;
          fVar165 = fVar231 * fVar165 + fStack_41c * fVar241;
          fVar304 = fVar166 * (1.0 - fVar226) + fVar169 * fVar226;
          fStack_41c = fVar166 * (1.0 - fVar241) + fVar169 * fVar241;
          fVar74 = 1.0 / fVar74;
          auVar121._0_4_ = fVar164 - fVar215;
          auVar121._4_4_ = fVar165 - fVar216;
          auVar121._8_4_ = fVar164 - fVar164;
          auVar121._12_4_ = fVar165 - fVar165;
          auVar158._0_8_ = CONCAT44(fVar214 - fVar201,fVar204 - fVar199);
          auVar158._8_4_ = fVar204 - fVar204;
          auVar158._12_4_ = fVar214 - fVar214;
          auVar269._0_4_ = fVar170 - fVar228;
          auVar269._4_4_ = fVar175 - fVar243;
          auVar269._8_4_ = fVar170 - fVar170;
          auVar269._12_4_ = fVar175 - fVar175;
          auVar224._0_8_ = CONCAT44((fVar243 - fVar126) * 3.0,(fVar228 - fVar125) * 3.0);
          auVar224._8_4_ = (fVar170 - fVar143) * 3.0;
          auVar224._12_4_ = (fVar175 - fVar148) * 3.0;
          auVar195._0_8_ = CONCAT44((fVar201 - fVar243) * 3.0,(fVar199 - fVar228) * 3.0);
          auVar195._8_4_ = (fVar204 - fVar170) * 3.0;
          auVar195._12_4_ = (fVar214 - fVar175) * 3.0;
          auVar252._0_4_ = (fVar215 - fVar199) * 3.0;
          auVar252._4_4_ = (fVar216 - fVar201) * 3.0;
          auVar252._8_4_ = (fVar164 - fVar204) * 3.0;
          auVar252._12_4_ = (fVar165 - fVar214) * 3.0;
          auVar206._8_4_ = auVar195._8_4_;
          auVar206._0_8_ = auVar195._0_8_;
          auVar206._12_4_ = auVar195._12_4_;
          auVar128 = minps(auVar206,auVar252);
          auVar75 = maxps(auVar195,auVar252);
          auVar236._8_4_ = auVar224._8_4_;
          auVar236._0_8_ = auVar224._0_8_;
          auVar236._12_4_ = auVar224._12_4_;
          auVar130 = minps(auVar236,auVar128);
          auVar119 = maxps(auVar224,auVar75);
          auVar29._4_8_ = auVar75._8_8_;
          auVar29._0_4_ = auVar130._4_4_;
          auVar196._0_8_ = auVar29._0_8_ << 0x20;
          auVar196._8_4_ = auVar130._8_4_;
          auVar196._12_4_ = auVar130._12_4_;
          auVar197._8_8_ = auVar130._8_8_;
          auVar197._0_8_ = auVar196._8_8_;
          auVar30._4_8_ = auVar128._8_8_;
          auVar30._0_4_ = auVar119._4_4_;
          auVar207._0_8_ = auVar30._0_8_ << 0x20;
          auVar207._8_4_ = auVar119._8_4_;
          auVar207._12_4_ = auVar119._12_4_;
          auVar208._8_8_ = auVar119._8_8_;
          auVar208._0_8_ = auVar207._8_8_;
          auVar128 = minps(auVar130,auVar197);
          auVar75 = maxps(auVar119,auVar208);
          fVar241 = auVar128._0_4_ * fVar74;
          fVar242 = auVar128._4_4_ * fVar74;
          fVar260 = auVar128._8_4_ * fVar74;
          fVar271 = auVar128._12_4_ * fVar74;
          fVar204 = fVar74 * auVar75._0_4_;
          fVar215 = fVar74 * auVar75._4_4_;
          fVar226 = fVar74 * auVar75._8_4_;
          fVar74 = fVar74 * auVar75._12_4_;
          fVar307 = 1.0 / (fStack_41c - fVar304);
          auVar141._0_8_ = CONCAT44(fVar148 - fVar126,fVar143 - fVar125);
          auVar141._8_4_ = fVar143 - fVar143;
          auVar141._12_4_ = fVar148 - fVar148;
          auVar209._8_4_ = auVar141._8_4_;
          auVar209._0_8_ = auVar141._0_8_;
          auVar209._12_4_ = auVar141._12_4_;
          auVar119 = minps(auVar209,auVar269);
          auVar128 = maxps(auVar141,auVar269);
          auVar100._8_4_ = auVar158._8_4_;
          auVar100._0_8_ = auVar158._0_8_;
          auVar100._12_4_ = auVar158._12_4_;
          auVar75 = minps(auVar100,auVar121);
          auVar119 = minps(auVar119,auVar75);
          auVar75 = maxps(auVar158,auVar121);
          auVar75 = maxps(auVar128,auVar75);
          fVar255 = auVar119._0_4_ * fVar307;
          fVar257 = auVar119._4_4_ * fVar307;
          fVar231 = fVar307 * auVar75._0_4_;
          fVar307 = fVar307 * auVar75._4_4_;
          local_418 = CONCAT44(fStack_41c,fVar304);
          auVar198._4_4_ = fStack_41c;
          auVar198._0_4_ = fVar105;
          auVar198._8_4_ = fVar124;
          auVar198._12_4_ = fVar103;
          fVar125 = (fVar104 + fVar105) * 0.5;
          fVar126 = (fVar304 + fStack_41c) * 0.5;
          fVar143 = (fVar105 + fVar124) * 0.0;
          fVar148 = (fStack_41c + fVar103) * 0.0;
          fVar164 = local_88 * fVar125 + local_308;
          fVar166 = fStack_84 * fVar125 + fStack_304;
          fVar165 = fStack_80 * fVar125 + fStack_300;
          fVar169 = fStack_7c * fVar125 + fStack_2fc;
          fVar170 = local_98 * fVar125 + (float)local_318._0_4_;
          fVar175 = fStack_94 * fVar125 + (float)local_318._4_4_;
          fVar199 = fStack_90 * fVar125 + fStack_310;
          fVar201 = fStack_8c * fVar125 + fStack_30c;
          fVar164 = (fVar170 - fVar164) * fVar125 + fVar164;
          fVar166 = (fVar175 - fVar166) * fVar125 + fVar166;
          fVar165 = (fVar199 - fVar165) * fVar125 + fVar165;
          fVar169 = (fVar201 - fVar169) * fVar125 + fVar169;
          fVar170 = (((local_a8 * fVar125 + (float)local_328) - fVar170) * fVar125 + fVar170) -
                    fVar164;
          fVar175 = (((fStack_a4 * fVar125 + local_328._4_4_) - fVar175) * fVar125 + fVar175) -
                    fVar166;
          fVar199 = (((fStack_a0 * fVar125 + (float)uStack_320) - fVar199) * fVar125 + fVar199) -
                    fVar165;
          fVar201 = (((fStack_9c * fVar125 + uStack_320._4_4_) - fVar201) * fVar125 + fVar201) -
                    fVar169;
          fVar164 = fVar125 * fVar170 + fVar164;
          fVar166 = fVar125 * fVar175 + fVar166;
          fVar170 = fVar170 * 3.0;
          fVar175 = fVar175 * 3.0;
          fVar165 = (fVar125 * fVar199 + fVar165) - fVar164;
          fVar169 = (fVar125 * fVar201 + fVar169) - fVar166;
          fVar170 = (fVar199 * 3.0 - fVar170) * fVar126 + fVar170;
          fVar175 = (fVar201 * 3.0 - fVar175) * fVar126 + fVar175;
          auVar122._0_8_ = CONCAT44(fVar170,fVar165) ^ 0x80000000;
          auVar122._8_4_ = fVar170;
          auVar122._12_4_ = fVar170;
          fVar274 = fVar104 - fVar125;
          fVar279 = fVar304 - fVar126;
          fVar289 = fVar105 - fVar143;
          fVar291 = fStack_41c - fVar148;
          fVar293 = fVar105 - fVar125;
          fVar295 = fStack_41c - fVar126;
          fVar124 = fVar124 - fVar143;
          fVar103 = fVar103 - fVar148;
          fVar164 = fVar165 * fVar126 + fVar164;
          fVar166 = fVar169 * fVar126 + fVar166;
          auVar142._0_8_ = CONCAT44(fVar175,fVar169) ^ 0x8000000000000000;
          auVar142._8_4_ = -fVar175;
          auVar142._12_4_ = -fVar175;
          auVar301._0_4_ = fVar169 * fVar170 - fVar175 * fVar165;
          auVar301._4_4_ = auVar301._0_4_;
          auVar301._8_4_ = auVar301._0_4_;
          auVar301._12_4_ = auVar301._0_4_;
          auVar128 = divps(auVar142,auVar301);
          auVar75 = divps(auVar122,auVar301);
          fVar170 = auVar128._0_4_;
          fVar175 = auVar128._4_4_;
          fVar165 = auVar75._0_4_;
          fVar169 = auVar75._4_4_;
          fVar125 = fVar125 - (fVar166 * fVar165 + fVar164 * fVar170);
          fVar143 = fVar126 - (fVar166 * fVar169 + fVar164 * fVar175);
          fVar148 = fVar126 - (fVar166 * auVar75._8_4_ + fVar164 * auVar128._8_4_);
          fVar126 = fVar126 - (fVar166 * auVar75._12_4_ + fVar164 * auVar128._12_4_);
          auVar323._0_8_ = CONCAT44(fVar175 * fVar255,fVar175 * fVar241);
          auVar323._8_4_ = fVar175 * fVar242;
          auVar323._12_4_ = fVar175 * fVar257;
          auVar253._0_4_ = fVar175 * fVar204;
          auVar253._4_4_ = fVar175 * fVar231;
          auVar253._8_4_ = fVar175 * fVar215;
          auVar253._12_4_ = fVar175 * fVar307;
          auVar329._8_4_ = auVar323._8_4_;
          auVar329._0_8_ = auVar323._0_8_;
          auVar329._12_4_ = auVar323._12_4_;
          auVar130 = minps(auVar329,auVar253);
          auVar128 = maxps(auVar253,auVar323);
          auVar159._0_8_ = CONCAT44(fVar169 * fVar257,fVar169 * fVar242);
          auVar159._8_4_ = fVar169 * fVar260;
          auVar159._12_4_ = fVar169 * fVar271;
          auVar324._0_4_ = fVar169 * fVar215;
          auVar324._4_4_ = fVar169 * fVar307;
          auVar324._8_4_ = fVar169 * fVar226;
          auVar324._12_4_ = fVar169 * fVar74;
          auVar237._8_4_ = auVar159._8_4_;
          auVar237._0_8_ = auVar159._0_8_;
          auVar237._12_4_ = auVar159._12_4_;
          auVar75 = minps(auVar237,auVar324);
          auVar119 = maxps(auVar324,auVar159);
          fVar164 = 0.0 - (auVar119._0_4_ + auVar128._0_4_);
          fVar166 = 1.0 - (auVar119._4_4_ + auVar128._4_4_);
          fVar199 = 0.0 - (auVar119._8_4_ + auVar128._8_4_);
          fVar201 = 0.0 - (auVar119._12_4_ + auVar128._12_4_);
          fVar214 = 0.0 - (auVar75._0_4_ + auVar130._0_4_);
          fVar216 = 1.0 - (auVar75._4_4_ + auVar130._4_4_);
          fVar228 = 0.0 - (auVar75._8_4_ + auVar130._8_4_);
          fVar243 = 0.0 - (auVar75._12_4_ + auVar130._12_4_);
          auVar254._0_8_ = CONCAT44(fVar279 * fVar166,fVar274 * fVar164);
          auVar254._8_4_ = fVar289 * fVar199;
          auVar254._12_4_ = fVar291 * fVar201;
          auVar302._0_8_ = CONCAT44(fVar255 * fVar170,fVar241 * fVar170);
          auVar302._8_4_ = fVar242 * fVar170;
          auVar302._12_4_ = fVar257 * fVar170;
          auVar238._0_4_ = fVar170 * fVar204;
          auVar238._4_4_ = fVar170 * fVar231;
          auVar238._8_4_ = fVar170 * fVar215;
          auVar238._12_4_ = fVar170 * fVar307;
          auVar311._8_4_ = auVar302._8_4_;
          auVar311._0_8_ = auVar302._0_8_;
          auVar311._12_4_ = auVar302._12_4_;
          auVar128 = minps(auVar311,auVar238);
          auVar75 = maxps(auVar238,auVar302);
          auVar210._0_8_ = CONCAT44(fVar257 * fVar165,fVar242 * fVar165);
          auVar210._8_4_ = fVar260 * fVar165;
          auVar210._12_4_ = fVar271 * fVar165;
          auVar325._0_4_ = fVar165 * fVar215;
          auVar325._4_4_ = fVar165 * fVar307;
          auVar325._8_4_ = fVar165 * fVar226;
          auVar325._12_4_ = fVar165 * fVar74;
          auVar330._8_4_ = auVar210._8_4_;
          auVar330._0_8_ = auVar210._0_8_;
          auVar330._12_4_ = auVar210._12_4_;
          auVar130 = minps(auVar330,auVar325);
          auVar303._0_4_ = fVar274 * fVar214;
          auVar303._4_4_ = fVar279 * fVar216;
          auVar303._8_4_ = fVar289 * fVar228;
          auVar303._12_4_ = fVar291 * fVar243;
          auVar160._0_8_ = CONCAT44(fVar166 * fVar295,fVar164 * fVar293);
          auVar160._8_4_ = fVar199 * fVar124;
          auVar160._12_4_ = fVar201 * fVar103;
          auVar168._0_4_ = fVar214 * fVar293;
          auVar168._4_4_ = fVar216 * fVar295;
          auVar168._8_4_ = fVar228 * fVar124;
          auVar168._12_4_ = fVar243 * fVar103;
          auVar119 = maxps(auVar325,auVar210);
          auVar322._0_4_ = auVar119._0_4_ + auVar75._0_4_;
          auVar322._4_4_ = auVar119._4_4_ + auVar75._4_4_;
          auVar322._8_4_ = auVar119._8_4_ + auVar75._8_4_;
          auVar322._12_4_ = auVar119._12_4_ + auVar75._12_4_;
          fVar74 = 1.0 - (auVar130._0_4_ + auVar128._0_4_);
          fVar164 = 0.0 - (auVar130._4_4_ + auVar128._4_4_);
          fVar166 = 0.0 - (auVar130._8_4_ + auVar128._8_4_);
          fVar199 = 0.0 - (auVar130._12_4_ + auVar128._12_4_);
          auVar239._0_8_ =
               CONCAT44(fVar279 * (0.0 - auVar322._4_4_),fVar274 * (1.0 - auVar322._0_4_));
          auVar239._8_4_ = fVar289 * (0.0 - auVar322._8_4_);
          auVar239._12_4_ = fVar291 * (0.0 - auVar322._12_4_);
          auVar270._0_4_ = fVar274 * fVar74;
          auVar270._4_4_ = fVar279 * fVar164;
          auVar270._8_4_ = fVar289 * fVar166;
          auVar270._12_4_ = fVar291 * fVar199;
          auVar211._0_8_ =
               CONCAT44((0.0 - auVar322._4_4_) * fVar295,(1.0 - auVar322._0_4_) * fVar293);
          auVar211._8_4_ = (0.0 - auVar322._8_4_) * fVar124;
          auVar211._12_4_ = (0.0 - auVar322._12_4_) * fVar103;
          auVar225._0_4_ = fVar74 * fVar293;
          auVar225._4_4_ = fVar164 * fVar295;
          auVar225._8_4_ = fVar166 * fVar124;
          auVar225._12_4_ = fVar199 * fVar103;
          auVar288._8_4_ = auVar239._8_4_;
          auVar288._0_8_ = auVar239._0_8_;
          auVar288._12_4_ = auVar239._12_4_;
          auVar75 = minps(auVar288,auVar270);
          auVar312._8_4_ = auVar211._8_4_;
          auVar312._0_8_ = auVar211._0_8_;
          auVar312._12_4_ = auVar211._12_4_;
          auVar128 = minps(auVar312,auVar225);
          auVar130 = minps(auVar75,auVar128);
          auVar128 = maxps(auVar270,auVar239);
          auVar75 = maxps(auVar225,auVar211);
          auVar119 = maxps(auVar75,auVar128);
          auVar212._8_4_ = auVar254._8_4_;
          auVar212._0_8_ = auVar254._0_8_;
          auVar212._12_4_ = auVar254._12_4_;
          auVar75 = minps(auVar212,auVar303);
          auVar240._8_4_ = auVar160._8_4_;
          auVar240._0_8_ = auVar160._0_8_;
          auVar240._12_4_ = auVar160._12_4_;
          auVar128 = minps(auVar240,auVar168);
          auVar128 = minps(auVar75,auVar128);
          auVar320 = maxps(auVar303,auVar254);
          auVar75 = maxps(auVar168,auVar160);
          auVar75 = maxps(auVar75,auVar320);
          auVar213._0_4_ = auVar130._4_4_ + auVar130._0_4_ + fVar125;
          auVar213._4_4_ = auVar128._4_4_ + auVar128._0_4_ + fVar143;
          auVar213._8_4_ = auVar130._8_4_ + auVar130._4_4_ + fVar148;
          auVar213._12_4_ = auVar130._12_4_ + auVar128._4_4_ + fVar126;
          fVar74 = auVar119._4_4_ + auVar119._0_4_ + fVar125;
          fVar103 = auVar75._4_4_ + auVar75._0_4_ + fVar143;
          auVar161._4_4_ = fVar103;
          auVar161._0_4_ = fVar74;
          auVar32._4_4_ = fVar304;
          auVar32._0_4_ = fVar104;
          auVar32._8_4_ = fVar105;
          auVar32._12_4_ = fStack_41c;
          auVar128 = maxps(auVar32,auVar213);
          auVar161._8_4_ = auVar119._8_4_ + auVar119._4_4_ + fVar148;
          auVar161._12_4_ = auVar119._12_4_ + auVar75._4_4_ + fVar126;
          auVar75 = minps(auVar161,auVar198);
          iVar61 = -(uint)(auVar75._0_4_ < auVar128._0_4_);
          iVar70 = -(uint)(auVar75._4_4_ < auVar128._4_4_);
          auVar163._4_4_ = iVar70;
          auVar163._0_4_ = iVar61;
          auVar163._8_4_ = iVar70;
          auVar163._12_4_ = iVar70;
          auVar162._8_8_ = auVar163._8_8_;
          auVar162._4_4_ = iVar61;
          auVar162._0_4_ = iVar61;
          uVar71 = movmskpd((int)pRVar62,auVar162);
          pRVar62 = (RTCIntersectArguments *)(ulong)uVar71;
          fStack_420 = fVar105;
          if (uVar71 == 0) {
            pRVar62 = (RTCIntersectArguments *)0x0;
            if (auVar213._0_4_ <= fVar104) {
              auVar322._0_12_ = ZEXT812(0x40400000);
              auVar322._12_4_ = 0.0;
              auVar331._4_4_ = fStack_304;
              auVar331._0_4_ = local_308;
              auVar331._8_4_ = fStack_300;
              auVar331._12_4_ = fStack_2fc;
            }
            else {
              auVar322._0_12_ = ZEXT812(0x40400000);
              auVar322._12_4_ = 0.0;
              auVar331._4_4_ = fStack_304;
              auVar331._0_4_ = local_308;
              auVar331._8_4_ = fStack_300;
              auVar331._12_4_ = fStack_2fc;
              if (fVar74 < fVar105) {
                iVar61 = -(uint)(fVar103 < fStack_41c);
                pRVar62 = (RTCIntersectArguments *)
                          (ulong)CONCAT11((char)((uint)iVar61 >> 8),
                                          (byte)iVar61 & fVar304 < auVar213._4_4_);
              }
            }
            bVar56 = bVar67 | (byte)pRVar62;
            if (bVar56 == 1) {
              paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)&DAT_000000c8;
              do {
                fVar103 = 1.0 - fVar125;
                fVar124 = fVar125 * fVar125 * fVar125;
                fVar148 = auVar322._0_4_;
                fVar105 = fVar125 * fVar125 * fVar148 * fVar103;
                fVar74 = fVar103 * fVar103 * fVar103;
                fVar126 = fVar125 * fVar148 * fVar103 * fVar103;
                fVar103 = fVar74 * auVar331._0_4_ +
                          fVar126 * (float)local_318._0_4_ +
                          fVar105 * (float)local_328 + fVar124 * (float)local_b8._0_4_;
                fVar104 = fVar74 * auVar331._4_4_ +
                          fVar126 * (float)local_318._4_4_ +
                          fVar105 * local_328._4_4_ + fVar124 * (float)local_b8._4_4_;
                fVar103 = ((fVar74 * auVar331._8_4_ +
                           fVar126 * fStack_310 + fVar105 * (float)uStack_320 + fVar124 * fStack_b0)
                          - fVar103) * fVar143 + fVar103;
                fVar104 = ((fVar74 * auVar331._12_4_ +
                           fVar126 * fStack_30c + fVar105 * uStack_320._4_4_ + fVar124 * fStack_ac)
                          - fVar104) * fVar143 + fVar104;
                fVar125 = fVar125 - (fVar104 * fVar165 + fVar103 * fVar170);
                fVar143 = fVar143 - (fVar104 * fVar169 + fVar103 * fVar175);
                fVar74 = ABS(fVar104);
                if (ABS(fVar104) <= ABS(fVar103)) {
                  fVar74 = ABS(fVar103);
                }
                if (fVar74 < fVar145) {
                  if ((((0.0 <= fVar125) && (fVar125 <= 1.0)) && (0.0 <= fVar143)) &&
                     (fVar143 <= 1.0)) {
                    fVar74 = (pre->ray_space).vx.field_0.m128[2];
                    fVar103 = (pre->ray_space).vy.field_0.m128[2];
                    fVar104 = (pre->ray_space).vz.field_0.m128[2];
                    fVar105 = (ray->super_RayK<1>).org.field_0.m128[0];
                    fVar124 = (ray->super_RayK<1>).org.field_0.m128[1];
                    fVar126 = (ray->super_RayK<1>).org.field_0.m128[2];
                    fVar170 = 1.0 - fVar143;
                    fVar169 = 1.0 - fVar125;
                    fVar164 = fVar169 * fVar169 * fVar169;
                    fVar165 = fVar125 * fVar148 * fVar169 * fVar169;
                    fVar166 = fVar125 * fVar125 * fVar125;
                    fVar148 = fVar125 * fVar125 * fVar148 * fVar169;
                    fVar74 = (((fStack_370 - fVar126) * fVar104 +
                              (fStack_374 - fVar124) * fVar103 + (local_378 - fVar105) * fVar74) *
                              fVar170 +
                             ((fStack_360 - fVar126) * fVar104 +
                             (fStack_364 - fVar124) * fVar103 + (local_368 - fVar105) * fVar74) *
                             fVar143) * fVar164 +
                             (((fStack_380 - fVar126) * fVar104 +
                              (fStack_384 - fVar124) * fVar103 + (local_388 - fVar105) * fVar74) *
                              fVar170 +
                             ((fStack_350 - fVar126) * fVar104 +
                             (fStack_354 - fVar124) * fVar103 + (local_358 - fVar105) * fVar74) *
                             fVar143) * fVar165 +
                             (((fStack_390 - fVar126) * fVar104 +
                              (fStack_394 - fVar124) * fVar103 + (local_398 - fVar105) * fVar74) *
                              fVar170 +
                             ((local_3cc.m128[3] - fVar126) * fVar104 +
                             (local_3cc.m128[2] - fVar124) * fVar103 +
                             (local_3cc.m128[1] - fVar105) * fVar74) * fVar143) * fVar148 +
                             (fVar170 * ((fStack_3b0 - fVar126) * fVar104 +
                                        (fStack_3b4 - fVar124) * fVar103 +
                                        (local_3b8 - fVar105) * fVar74) +
                             ((fStack_2b0 - fVar126) * fVar104 +
                             (fStack_2b4 - fVar124) * fVar103 + (local_2b8 - fVar105) * fVar74) *
                             fVar143) * fVar166;
                    if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar74) &&
                       (fVar103 = (ray->super_RayK<1>).tfar, fVar74 <= fVar103)) {
                      fVar126 = 1.0 - fVar143;
                      fVar170 = 1.0 - fVar143;
                      fVar175 = 1.0 - fVar143;
                      fVar104 = local_388 * fVar126 + local_358 * fVar143;
                      fVar105 = fStack_384 * fVar170 + fStack_354 * fVar143;
                      fVar124 = fStack_380 * fVar175 + fStack_350 * fVar143;
                      fVar199 = local_398 * fVar126 + local_3cc.m128[1] * fVar143;
                      fVar204 = fStack_394 * fVar170 + local_3cc.m128[2] * fVar143;
                      fVar215 = fStack_390 * fVar175 + local_3cc.m128[3] * fVar143;
                      fVar201 = fVar199 - fVar104;
                      fVar214 = fVar204 - fVar105;
                      fVar216 = fVar215 - fVar124;
                      fVar104 = (((fVar104 - (local_378 * fVar126 + local_368 * fVar143)) * fVar169
                                 + fVar125 * fVar201) * fVar169 +
                                (fVar201 * fVar169 +
                                ((fVar126 * local_3b8 + fVar143 * local_2b8) - fVar199) * fVar125) *
                                fVar125) * 3.0;
                      fVar105 = (((fVar105 - (fStack_374 * fVar170 + fStack_364 * fVar143)) *
                                  fVar169 + fVar125 * fVar214) * fVar169 +
                                (fVar214 * fVar169 +
                                ((fVar170 * fStack_3b4 + fVar143 * fStack_2b4) - fVar204) * fVar125)
                                * fVar125) * 3.0;
                      fVar124 = (((fVar124 - (fStack_370 * fVar175 + fStack_360 * fVar143)) *
                                  fVar169 + fVar125 * fVar216) * fVar169 +
                                (fVar216 * fVar169 +
                                ((fVar175 * fStack_3b0 + fVar143 * fStack_2b0) - fVar215) * fVar125)
                                * fVar125) * 3.0;
                      pGVar15 = (context->scene->geometries).items[uVar69].ptr;
                      uVar71 = (ray->super_RayK<1>).mask;
                      paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar71;
                      pRVar62 = (RTCIntersectArguments *)context;
                      if ((pGVar15->mask & uVar71) != 0) {
                        fVar169 = fVar164 * local_178 +
                                  fVar165 * local_188 + fVar148 * local_198 + fVar166 * local_1a8;
                        fVar170 = fVar164 * fStack_174 +
                                  fVar165 * fStack_184 + fVar148 * fStack_194 + fVar166 * fStack_1a4
                        ;
                        fVar148 = fVar164 * fStack_170 +
                                  fVar165 * fStack_180 + fVar148 * fStack_190 + fVar166 * fStack_1a0
                        ;
                        fVar126 = fVar170 * fVar104 - fVar105 * fVar169;
                        fVar105 = fVar148 * fVar105 - fVar124 * fVar170;
                        fVar104 = fVar169 * fVar124 - fVar104 * fVar148;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar74;
                          *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar104,fVar105);
                          (ray->Ng).field_0.field_0.z = fVar126;
                          ray->u = fVar125;
                          ray->v = fVar143;
                          ray->primID = (uint)local_340;
                          ray->geomID = uVar69;
                          ray->instID[0] = context->user->instID[0];
                          uVar71 = context->user->instPrimID[0];
                          ray->instPrimID[0] = uVar71;
                          paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar71;
                        }
                        else {
                          local_1e8 = CONCAT44(fVar104,fVar105);
                          local_1e0 = fVar126;
                          local_1dc = fVar125;
                          fStack_1d8 = fVar143;
                          local_1d4 = (uint)local_340;
                          local_1d0 = uVar69;
                          local_1cc = context->user->instID[0];
                          pRVar62 = (RTCIntersectArguments *)(ulong)local_1cc;
                          local_1c8 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar74;
                          local_3cc.m128[0] = -NAN;
                          local_2e8.valid = (int *)&local_3cc;
                          local_2e8.geometryUserPtr = pGVar15->userPtr;
                          local_2e8.context = context->user;
                          local_2e8.ray = (RTCRayN *)ray;
                          local_2e8.hit = (RTCHitN *)&local_1e8;
                          local_2e8.N = 1;
                          if (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00c341eb:
                            pRVar62 = context->args;
                            if ((RTCIntersectArguments *)pRVar62->filter !=
                                (RTCIntersectArguments *)0x0) {
                              if ((((ulong)*(Scene **)&pRVar62->flags & 2) != 0) ||
                                 (((pGVar15->field_8).field_0x2 & 0x40) != 0)) {
                                (*(code *)pRVar62->filter)(&local_2e8);
                              }
                              if (*(float *)local_2e8.valid == 0.0) goto LAB_00c34287;
                            }
                            *(float *)((long)local_2e8.ray + 0x30) = *(float *)local_2e8.hit;
                            *(float *)((long)local_2e8.ray + 0x34) = *(float *)(local_2e8.hit + 4);
                            *(float *)((long)local_2e8.ray + 0x38) = *(float *)(local_2e8.hit + 8);
                            *(float *)((long)local_2e8.ray + 0x3c) = *(float *)(local_2e8.hit + 0xc)
                            ;
                            *(float *)((long)local_2e8.ray + 0x40) =
                                 *(float *)(local_2e8.hit + 0x10);
                            *(float *)((long)local_2e8.ray + 0x44) =
                                 *(float *)(local_2e8.hit + 0x14);
                            *(float *)((long)local_2e8.ray + 0x48) =
                                 *(float *)(local_2e8.hit + 0x18);
                            *(float *)((long)local_2e8.ray + 0x4c) =
                                 *(float *)(local_2e8.hit + 0x1c);
                            pRVar62 = (RTCIntersectArguments *)
                                      (ulong)(uint)*(float *)(local_2e8.hit + 0x20);
                            *(float *)((long)local_2e8.ray + 0x50) =
                                 *(float *)(local_2e8.hit + 0x20);
                            paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_2e8.ray;
                          }
                          else {
                            uStack_3a0 = auVar99._8_8_;
                            local_3a8 = auVar66;
                            (*pGVar15->intersectionFilterN)(&local_2e8);
                            auVar66 = local_3a8;
                            if (*(float *)local_2e8.valid != 0.0) goto LAB_00c341eb;
LAB_00c34287:
                            (ray->super_RayK<1>).tfar = fVar103;
                            paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_2e8.valid;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)((long)paVar59 + -1);
              } while (paVar59 != (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0x0);
            }
            else {
              bVar21 = false;
              paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar28,bVar56);
            }
          }
        }
      }
    } while (bVar21);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }